

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O3

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::QuadMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::QuadMesh,_embree::QuadMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::QuadMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::QuadMesh,_embree::QuadMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  Split *pSVar3;
  int iVar4;
  undefined4 uVar5;
  __base_type _Var6;
  MemoryMonitorInterface *pMVar7;
  NodeRefPtr<4> this_00;
  ThreadLocal2 *pTVar8;
  iterator iVar9;
  BBox1f *pBVar10;
  PrimRefMB *pPVar11;
  Scene *pSVar12;
  Geometry *pGVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  vuint<4> vVar24;
  vint *pvVar25;
  unsigned_long uVar26;
  unsigned_long uVar27;
  BBox1f BVar28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  char cVar30;
  uint uVar31;
  long lVar32;
  long lVar33;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *this_01;
  long lVar34;
  void *pvVar35;
  ulong uVar36;
  long lVar37;
  size_t sVar38;
  undefined8 *puVar39;
  runtime_error *prVar40;
  BBox1f *pBVar41;
  long lVar42;
  BBox1f BVar43;
  uint *puVar44;
  ulong uVar45;
  long lVar46;
  float *pfVar47;
  __pointer_type *ppBVar48;
  __pointer_type pBVar49;
  char *pcVar50;
  ulong uVar51;
  byte bVar52;
  BuildRecord *in_00;
  undefined8 uVar53;
  long lVar54;
  byte bVar55;
  size_t i;
  PrimRefMB *pPVar56;
  uint uVar57;
  __pointer_type pBVar58;
  code *pcVar59;
  ulong uVar60;
  ulong uVar61;
  mvector<PrimRefMB> *prims;
  long *plVar62;
  ulong uVar63;
  bool bVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined8 uVar73;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  float fVar74;
  float fVar85;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  float fVar95;
  float fVar96;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar97;
  undefined1 auVar94 [16];
  float fVar98;
  float fVar102;
  float fVar103;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar104;
  undefined1 auVar101 [16];
  undefined1 auVar105 [16];
  float fVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar115;
  undefined1 auVar116 [16];
  float fVar120;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar121;
  float fVar126;
  float fVar127;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar128;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [64];
  undefined1 auVar133 [16];
  float fVar134;
  undefined1 auVar135 [64];
  BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::QuadMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::QuadMesh,_embree::QuadMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
  *pBVar136;
  BBox1f local_1e60;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1e58;
  HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::avx::RecalculatePrimRef<embree::QuadMesh>,_2UL>
  *local_1e40;
  undefined1 local_1e38 [8];
  float fStack_1e30;
  float fStack_1e2c;
  undefined1 local_1e28 [16];
  undefined1 local_1e18 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e08;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1df8;
  NodeRecordMB4D *local_1de8;
  MemoryMonitorInterface **local_1de0;
  BBox1f time_range1;
  BBox1f time_range0;
  undefined1 local_1dc8 [16];
  PrimRefVector lprims;
  undefined1 local_1d98 [16];
  PrimInfoMB right;
  vuint<4> v2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1cd8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1cc8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1cb8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ca8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1c98;
  __pointer_type local_1c88;
  __pointer_type pBStack_1c80;
  MemoryMonitorInterface *pMStack_1c78;
  MemoryMonitorInterface *pMStack_1c70;
  float local_1c68;
  float fStack_1c64;
  float fStack_1c60;
  float fStack_1c5c;
  anon_class_1_0_00000001 reduction;
  undefined4 local_1c38;
  undefined4 local_1c28;
  vuint<4> v0;
  undefined1 local_1c08 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1bf8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1be8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1bd8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1bc8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1bb8;
  __pointer_type local_1ba8;
  __pointer_type pBStack_1ba0;
  MemoryMonitorInterface *pMStack_1b98;
  size_t sStack_1b90;
  undefined1 auStack_1b88 [16];
  BBox1f local_1b78;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  longlong local_1b58;
  longlong local_1b48;
  longlong lStack_1b40;
  longlong lStack_1b38;
  longlong lStack_1b30;
  vuint<4> v1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b18;
  undefined8 uStack_1b08;
  undefined8 uStack_1b00;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 uStack_1ae0;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 uStack_1ac0;
  __pointer_type local_1ab8;
  __pointer_type pBStack_1ab0;
  __pointer_type pBStack_1aa8;
  __pointer_type pBStack_1aa0;
  undefined1 auStack_1a98 [16];
  BBox1f local_1a88;
  undefined8 local_1a78;
  undefined8 uStack_1a70;
  undefined8 local_1a68;
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 uStack_1a40;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_19e8 [16];
  anon_class_24_3_c5d13451 isLeft;
  vint vSplitPos;
  BuildRecordSplit current;
  vuint<4> geomID;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_17b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_17a8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1798;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1788;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1778;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1768;
  __pointer_type local_1758;
  atomic<embree::FastAllocator::Block_*> aStack_1750;
  size_t sStack_1748;
  size_t sStack_1740;
  BBox1f local_1738;
  float fStack_1730;
  uint uStack_172c;
  BBox1f local_1728 [2];
  undefined1 local_1718 [8];
  size_t sStack_1710;
  int local_1708;
  int aiStack_1704 [3];
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16e8 [226];
  BBox1f *local_8c8 [16];
  ulong local_848;
  BBox1f local_840;
  undefined8 local_838 [14];
  BBox1f aBStack_7c8 [49];
  long local_640;
  NodeRecordMB4D values [16];
  
  uVar51 = in->depth;
  local_1de8 = __return_storage_ptr__;
  if ((this->cfg).maxDepth < uVar51) {
    puVar39 = (undefined8 *)__cxa_allocate_exception(0x30);
    geomID.field_0.v[0] = (longlong)&local_17b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&geomID,"depth limit reached","");
    *puVar39 = &PTR__rtcore_error_02184a18;
    *(undefined4 *)(puVar39 + 1) = 1;
    puVar39[2] = puVar39 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar39 + 2),geomID.field_0.v[0],geomID.field_0.v[1] + geomID.field_0.v[0]
              );
    __cxa_throw(puVar39,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  local_1df8 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds0.lower.field_0;
  aVar22 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
            (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
            bounds0.upper.field_0.m128;
  local_1e58 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds1.lower.field_0.m128;
  _local_1e38 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                 (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds1.upper.field_0.m128;
  local_1e08 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                centBounds.lower.field_0.m128;
  aVar23 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
            (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
            upper.field_0.m128;
  pBVar49 = (__pointer_type)(in->prims).super_PrimInfoMB.object_range._begin;
  _Var6._M_p = (__pointer_type)(in->prims).super_PrimInfoMB.object_range._end;
  values[0].ref.ptr = (in->prims).super_PrimInfoMB.num_time_segments;
  values[0]._8_8_ = (in->prims).super_PrimInfoMB.max_num_time_segments;
  values[0].lbounds.bounds0.lower.field_0._0_8_ = (in->prims).super_PrimInfoMB.max_time_range;
  values[0].lbounds.bounds0.lower.field_0._8_8_ = (in->prims).super_PrimInfoMB.time_range;
  BVar43 = (BBox1f)(in->prims).prims;
  uVar53 = &geomID;
  findFallback((Split *)uVar53,this,&in->prims);
  local_16e8[0] = local_1798;
  uVar73 = local_17b8._0_8_;
  _local_1718 = geomID.field_0;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.lower.field_0 = local_1df8;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.lower.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)local_1e58;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.upper.field_0 = _local_1e38;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.lower.field_0 = local_1e08;
  current.super_BuildRecord.prims.super_PrimInfoMB.num_time_segments = values[0].ref.ptr;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_num_time_segments = values[0]._8_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_time_range.lower =
       (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_time_range.upper =
       (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower =
       (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper =
       (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  BVar28 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
  current.split.sah = (float)geomID.field_0._0_4_;
  current.split.dim = geomID.field_0._4_4_;
  current.split.field_2.pos = local_1718._8_4_;
  current.split.data = local_1718._12_4_;
  current.split.mapping.num = local_17b8._0_8_;
  current.split.mapping.ofs.field_0._0_8_ = local_17a8._0_8_;
  current.split.mapping.ofs.field_0._8_8_ = local_17a8._8_8_;
  current.split.mapping.scale.field_0 = local_1798;
  uVar60 = (long)_Var6._M_p - (long)pBVar49;
  if (uVar60 == 0 || uVar51 != 1) {
    bVar52 = 0;
  }
  else {
    current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower =
         (float)values[0].lbounds.bounds0.lower.field_0._8_8_;
    current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper =
         (float)((ulong)values[0].lbounds.bounds0.lower.field_0._8_8_ >> 0x20);
    lVar42 = (long)_Var6._M_p - (long)pBVar49;
    if (_Var6._M_p < pBVar49 || lVar42 == 0) {
      auVar66 = ZEXT816(0xff8000007f800000);
    }
    else {
      pBVar41 = &(*(PrimRefMB **)((long)BVar43 + 0x20))[(long)pBVar49].time_range;
      auVar66 = ZEXT816(0xff8000007f800000);
      do {
        auVar82._8_8_ = 0;
        auVar82._0_4_ = pBVar41->lower;
        auVar82._4_4_ = pBVar41->upper;
        auVar68 = vcmpps_avx(auVar66,auVar82,1);
        auVar67 = vinsertps_avx(auVar66,auVar82,0x50);
        auVar66 = vblendps_avx(auVar82,auVar66,2);
        auVar66 = vblendvps_avx(auVar66,auVar67,auVar68);
        pBVar41 = pBVar41 + 10;
        lVar42 = lVar42 + -1;
      } while (lVar42 != 0);
    }
    auVar68 = vmovshdup_avx(auVar66);
    auVar68 = vcmpps_avx(auVar68,ZEXT416((uint)current.super_BuildRecord.prims.super_PrimInfoMB.
                                               time_range.upper),1);
    auVar66 = vcmpps_avx(ZEXT416((uint)current.super_BuildRecord.prims.super_PrimInfoMB.time_range.
                                       lower),auVar66,1);
    auVar66 = vorps_avx(auVar66,auVar68);
    bVar52 = auVar66[0] & 1;
  }
  current.super_BuildRecord.depth = uVar51;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.upper.field_0 = aVar22;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.upper.field_0 = aVar23;
  current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin = (unsigned_long)pBVar49;
  current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end = (unsigned_long)_Var6._M_p;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range = BVar28;
  current.super_BuildRecord.prims.prims = (PrimRefVector)BVar43;
  if (((uVar60 <= (this->cfg).maxLeafSize) && (current.split.data < 2)) && (bVar52 == 0)) {
    uVar51 = uVar60 + 3 >> 2;
    v1.field_0.v[0] = uVar51 * 0x60;
    this_00.ptr = (size_t)(alloc.talloc1)->parent;
    if (alloc.alloc != (((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = this_00.ptr;
      MutexSys::lock((MutexSys *)this_00.ptr);
      if ((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p != (__pointer_type)0x0
         ) {
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (long)*(void **)(this_00.ptr + 0xa8) + (long)*(void **)(this_00.ptr + 0x68);
        UNLOCK();
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((long)*(void **)(this_00.ptr + 0x58) + (long)*(void **)(this_00.ptr + 0x98)) -
             ((long)*(void **)(this_00.ptr + 0x50) + (long)*(void **)(this_00.ptr + 0x90)));
        UNLOCK();
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesWasted
        ;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (long)*(void **)(this_00.ptr + 0xb0) + (long)*(void **)(this_00.ptr + 0x70);
        UNLOCK();
      }
      auVar66 = ZEXT816(0) << 0x40;
      *(undefined1 (*) [32])(this_00.ptr + 0x58) = ZEXT1632(auVar66);
      *(undefined1 (*) [32])(this_00.ptr + 0x48) = ZEXT1632(auVar66);
      auVar72 = ZEXT1632(auVar66);
      if (alloc.alloc == (FastAllocator *)0x0) {
        *(undefined1 (*) [32])(this_00.ptr + 0x98) = auVar72;
        *(undefined1 (*) [32])(this_00.ptr + 0x88) = auVar72;
      }
      else {
        *(void **)(this_00.ptr + 0x60) = (void *)(alloc.alloc)->defaultBlockSize;
        *(undefined1 (*) [32])(this_00.ptr + 0x88) = auVar72;
        *(undefined1 (*) [32])(this_00.ptr + 0x98) = auVar72;
        *(void **)(this_00.ptr + 0xa0) = (void *)(alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p = alloc.alloc;
      UNLOCK();
      v0.field_0.v[0] = this_00.ptr;
      geomID.field_0.v[1]._0_1_ = 1;
      geomID.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar9._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar9,(ThreadLocal2 **)&v0);
      }
      else {
        *iVar9._M_current = (ThreadLocal2 *)v0.field_0.v[0];
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      _local_1718 = geomID.field_0;
      if (values[0]._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)values[0].ref.ptr);
        _local_1718 = geomID.field_0;
      }
    }
    geomID.field_0 = _local_1718;
    uVar53 = v1.field_0.v[0];
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + v1.field_0.v[0];
    sVar38 = (alloc.talloc1)->cur;
    uVar45 = (ulong)(-(int)sVar38 & 0x1f);
    uVar36 = sVar38 + v1.field_0.v[0] + uVar45;
    (alloc.talloc1)->cur = uVar36;
    if ((alloc.talloc1)->end < uVar36) {
      (alloc.talloc1)->cur = sVar38;
      uVar36 = (alloc.talloc1)->allocBlockSize;
      if ((ulong)(v1.field_0.v[0] * 4) < uVar36 || v1.field_0.v[0] * 4 - uVar36 == 0) {
        geomID.field_0.v[0] = uVar36;
        pcVar50 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&geomID);
        (alloc.talloc1)->ptr = pcVar50;
        sVar38 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar38;
        (alloc.talloc1)->end = geomID.field_0.v[0];
        (alloc.talloc1)->cur = uVar53;
        if ((ulong)geomID.field_0.v[0] < (ulong)uVar53) {
          (alloc.talloc1)->cur = 0;
          geomID.field_0.v[0] = (alloc.talloc1)->allocBlockSize;
          pcVar50 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&geomID);
          (alloc.talloc1)->ptr = pcVar50;
          sVar38 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar38;
          (alloc.talloc1)->end = geomID.field_0.v[0];
          (alloc.talloc1)->cur = uVar53;
          if ((ulong)geomID.field_0.v[0] < (ulong)uVar53) {
            (alloc.talloc1)->cur = 0;
            pcVar50 = (char *)0x0;
            goto LAB_013387d1;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar38;
      }
      else {
        pcVar50 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v1);
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar45;
      pcVar50 = (alloc.talloc1)->ptr + (uVar36 - v1.field_0._0_8_);
    }
LAB_013387d1:
    uVar36 = 7;
    if (uVar51 < 7) {
      uVar36 = uVar51;
    }
    if (uVar60 + 3 < 4) {
      auVar70._8_4_ = 0x7f800000;
      auVar70._0_8_ = 0x7f8000007f800000;
      auVar70._12_4_ = 0x7f800000;
      local_1e18._8_4_ = 0xff800000;
      local_1e18._0_8_ = 0xff800000ff800000;
      local_1e18._12_4_ = 0xff800000;
      local_1e28._8_4_ = 0xff800000;
      local_1e28._0_8_ = 0xff800000ff800000;
      local_1e28._12_4_ = 0xff800000;
      local_1d98 = auVar70;
    }
    else {
      auVar70._8_4_ = 0x7f800000;
      auVar70._0_8_ = 0x7f8000007f800000;
      auVar70._12_4_ = 0x7f800000;
      local_1e40 = (HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::avx::RecalculatePrimRef<embree::QuadMesh>,_2UL>
                    *)0x0;
      auVar135 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar132 = ZEXT1664(ZEXT816(0) << 0x40);
      local_1e28._8_4_ = 0xff800000;
      local_1e28._0_8_ = 0xff800000ff800000;
      local_1e28._12_4_ = 0xff800000;
      local_1e18._8_4_ = 0xff800000;
      local_1e18._0_8_ = 0xff800000ff800000;
      local_1e18._12_4_ = 0xff800000;
      local_1d98 = auVar70;
      do {
        pPVar11 = (current.super_BuildRecord.prims.prims)->items;
        pSVar12 = ((this->createLeaf).bvh)->scene;
        auVar79._8_8_ = 0;
        auVar79._0_4_ = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
        auVar79._4_4_ = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
        auVar80._8_8_ = 0;
        auVar80._0_4_ = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
        auVar80._4_4_ = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
        geomID.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpcmpeqd_avx(auVar79,auVar80)
        ;
        pPVar56 = pPVar11 + (long)pBVar49;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0 =
             auVar135._0_16_;
        lVar42 = 0;
        v2.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)
                     right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0;
        v0.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)
                     right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0;
        v1.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)
                     right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0;
        values[0]._0_16_ = (undefined1  [16])geomID.field_0;
        do {
          if (pBVar49 < current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end) {
            fVar74 = (pPVar56->lbounds).bounds0.lower.field_0.m128[3];
            *(float *)((long)&geomID.field_0 + lVar42) = fVar74;
            fVar85 = (pPVar56->lbounds).bounds0.upper.field_0.m128[3];
            *(float *)((long)&values[0].ref.ptr + lVar42) = fVar85;
            pGVar13 = (pSVar12->geometries).items[(uint)fVar74].ptr;
            lVar34 = (ulong)(uint)fVar85 *
                     pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
            lVar32 = *(long *)&pGVar13->field_0x58;
            uVar31 = *(uint *)&pGVar13[1].intersectionFilterN >> 2;
            *(uint *)((long)&v0.field_0 + lVar42) = *(int *)(lVar32 + lVar34) * uVar31;
            *(uint *)((long)&v1.field_0 + lVar42) = *(int *)(lVar32 + 4 + lVar34) * uVar31;
            *(uint *)((long)&v2.field_0 + lVar42) = *(int *)(lVar32 + 8 + lVar34) * uVar31;
            *(uint *)((long)&right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
                             .lower.field_0 + lVar42) = uVar31 * *(int *)(lVar32 + 0xc + lVar34);
            pBVar49 = (__pointer_type)
                      ((long)&(pBVar49->cur).super___atomic_base<unsigned_long>._M_i + 1);
          }
          else if (lVar42 != 0) {
            *(uint *)((long)&geomID.field_0 + lVar42) = geomID.field_0.i[0];
            *(undefined4 *)((long)&values[0].ref.ptr + lVar42) = 0xffffffff;
            uVar5 = v0.field_0.i[0];
            *(uint *)((long)&v0.field_0 + lVar42) = v0.field_0.i[0];
            *(undefined4 *)((long)&v1.field_0 + lVar42) = uVar5;
            *(undefined4 *)((long)&v2.field_0 + lVar42) = uVar5;
            *(undefined4 *)
             ((long)&right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0 + lVar42) = uVar5;
          }
          if (pBVar49 < current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end) {
            pPVar56 = pPVar11 + (long)pBVar49;
          }
          lVar42 = lVar42 + 4;
        } while (lVar42 != 0x10);
        lVar42 = (long)local_1e40 * 0x60;
        *(longlong *)(pcVar50 + lVar42) = v0.field_0.v[0];
        *(longlong *)((long)(pcVar50 + lVar42) + 8) = v0.field_0.v[1];
        *(longlong *)(pcVar50 + lVar42 + 0x10) = v1.field_0.v[0];
        *(longlong *)((long)(pcVar50 + lVar42 + 0x10) + 8) = v1.field_0.v[1];
        *(longlong *)(pcVar50 + lVar42 + 0x20) = v2.field_0.v[0];
        *(longlong *)((long)(pcVar50 + lVar42 + 0x20) + 8) = v2.field_0.v[1];
        *(undefined8 *)(pcVar50 + lVar42 + 0x30) =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        *(undefined8 *)(pcVar50 + lVar42 + 0x30 + 8) =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        *(longlong *)(pcVar50 + lVar42 + 0x40) = geomID.field_0.v[0];
        *(longlong *)((long)(pcVar50 + lVar42 + 0x40) + 8) = geomID.field_0.v[1];
        *(size_t *)(pcVar50 + lVar42 + 0x50) = values[0].ref.ptr;
        *(undefined8 *)((long)(pcVar50 + lVar42 + 0x50) + 8) = values[0]._8_8_;
        auVar67 = vmovshdup_avx(auVar79);
        lVar32 = 0;
        auVar81._8_4_ = 0xff800000;
        auVar81._0_8_ = 0xff800000ff800000;
        auVar81._12_4_ = 0xff800000;
        auVar71._8_4_ = 0x7f800000;
        auVar71._0_8_ = 0x7f8000007f800000;
        auVar71._12_4_ = 0x7f800000;
        auVar66 = auVar81;
        auVar68 = auVar71;
        do {
          if ((ulong)*(uint *)(pcVar50 + lVar32 * 4 + lVar42 + 0x50) == 0xffffffff) break;
          pGVar13 = (pSVar12->geometries).items[*(uint *)(pcVar50 + lVar32 * 4 + lVar42 + 0x40)].ptr
          ;
          fVar74 = pGVar13->fnumTimeSegments;
          fVar85 = (pGVar13->time_range).lower;
          local_1c28 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
          fVar115 = (pGVar13->time_range).upper - fVar85;
          fVar90 = ((float)local_1c28 - fVar85) / fVar115;
          local_1c38 = auVar67._0_4_;
          fVar115 = ((float)local_1c38 - fVar85) / fVar115;
          fVar85 = fVar74 * fVar90;
          fVar106 = fVar74 * fVar115;
          auVar86 = vroundss_avx(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85),9);
          auVar69 = vroundss_avx(ZEXT416((uint)fVar106),ZEXT416((uint)fVar106),10);
          auVar78 = auVar132._0_16_;
          auVar82 = vmaxss_avx(auVar86,auVar78);
          auVar77 = vminss_avx(auVar69,ZEXT416((uint)fVar74));
          iVar4 = (int)auVar86._0_4_;
          if ((int)auVar86._0_4_ < 0) {
            iVar4 = -1;
          }
          uVar31 = (int)fVar74 + 1U;
          if ((int)auVar69._0_4_ < (int)((int)fVar74 + 1U)) {
            uVar31 = (int)auVar69._0_4_;
          }
          lVar34 = *(long *)&pGVar13->field_0x58;
          lVar46 = (ulong)*(uint *)(pcVar50 + lVar32 * 4 + lVar42 + 0x50) *
                   pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          uVar63 = (ulong)*(uint *)(lVar34 + lVar46);
          uVar61 = (ulong)*(uint *)(lVar34 + 4 + lVar46);
          lVar33 = *(long *)&pGVar13[2].numPrimitives;
          lVar54 = (long)(int)auVar82._0_4_ * 0x38;
          lVar14 = *(long *)(lVar33 + lVar54);
          lVar37 = *(long *)(lVar33 + 0x10 + lVar54);
          auVar86 = *(undefined1 (*) [16])(lVar14 + lVar37 * uVar63);
          auVar69 = *(undefined1 (*) [16])(lVar14 + lVar37 * uVar61);
          uVar45 = (ulong)*(uint *)(lVar34 + 8 + lVar46);
          auVar87 = *(undefined1 (*) [16])(lVar14 + lVar37 * uVar45);
          fVar98 = auVar77._0_4_;
          uVar60 = (ulong)*(uint *)(lVar34 + 0xc + lVar46);
          auVar77 = *(undefined1 (*) [16])(lVar14 + lVar37 * uVar60);
          auVar65 = vminps_avx(auVar86,auVar69);
          auVar75 = vminps_avx(auVar87,auVar77);
          auVar91 = vminps_avx(auVar65,auVar75);
          lVar37 = (long)(int)fVar98 * 0x38;
          lVar34 = *(long *)(lVar33 + lVar37);
          lVar14 = *(long *)(lVar33 + 0x10 + lVar37);
          auVar65 = *(undefined1 (*) [16])(lVar34 + lVar14 * uVar63);
          auVar75 = *(undefined1 (*) [16])(lVar34 + lVar14 * uVar61);
          auVar76 = *(undefined1 (*) [16])(lVar34 + lVar14 * uVar45);
          auVar69 = vmaxps_avx(auVar86,auVar69);
          auVar86 = *(undefined1 (*) [16])(lVar34 + lVar14 * uVar60);
          auVar77 = vmaxps_avx(auVar87,auVar77);
          auVar77 = vmaxps_avx(auVar69,auVar77);
          auVar69 = vminps_avx(auVar65,auVar75);
          auVar87 = vminps_avx(auVar76,auVar86);
          auVar87 = vminps_avx(auVar69,auVar87);
          auVar69 = vmaxps_avx(auVar65,auVar75);
          auVar86 = vmaxps_avx(auVar76,auVar86);
          auVar86 = vmaxps_avx(auVar69,auVar86);
          auVar82 = ZEXT416((uint)(fVar85 - auVar82._0_4_));
          fVar134 = auVar87._0_4_;
          fVar121 = auVar91._0_4_;
          fVar102 = auVar77._0_4_;
          fVar103 = auVar77._4_4_;
          fVar104 = auVar77._8_4_;
          fVar120 = auVar77._12_4_;
          fVar85 = auVar87._4_4_;
          fVar15 = auVar87._8_4_;
          fVar16 = auVar87._12_4_;
          fVar112 = auVar86._0_4_;
          fVar95 = auVar86._4_4_;
          fVar96 = auVar86._8_4_;
          fVar97 = auVar86._12_4_;
          fVar126 = auVar91._4_4_;
          fVar127 = auVar91._8_4_;
          fVar128 = auVar91._12_4_;
          if (uVar31 - iVar4 == 1) {
            auVar82 = vmaxss_avx(auVar82,auVar78);
            auVar77 = vshufps_avx(auVar82,auVar82,0);
            auVar82 = ZEXT416((uint)(1.0 - auVar82._0_4_));
            auVar82 = vshufps_avx(auVar82,auVar82,0);
            auVar83._0_4_ = fVar121 * auVar82._0_4_ + fVar134 * auVar77._0_4_;
            auVar83._4_4_ = fVar126 * auVar82._4_4_ + fVar85 * auVar77._4_4_;
            auVar83._8_4_ = fVar127 * auVar82._8_4_ + fVar15 * auVar77._8_4_;
            auVar83._12_4_ = fVar128 * auVar82._12_4_ + fVar16 * auVar77._12_4_;
            auVar105._0_4_ = fVar102 * auVar82._0_4_ + fVar112 * auVar77._0_4_;
            auVar105._4_4_ = fVar103 * auVar82._4_4_ + fVar95 * auVar77._4_4_;
            auVar105._8_4_ = fVar104 * auVar82._8_4_ + fVar96 * auVar77._8_4_;
            auVar105._12_4_ = fVar120 * auVar82._12_4_ + fVar97 * auVar77._12_4_;
            auVar82 = vmaxss_avx(ZEXT416((uint)(fVar98 - fVar106)),auVar78);
            auVar77 = vshufps_avx(auVar82,auVar82,0);
            auVar82 = ZEXT416((uint)(1.0 - auVar82._0_4_));
            auVar82 = vshufps_avx(auVar82,auVar82,0);
            auVar93._0_4_ = fVar121 * auVar77._0_4_ + fVar134 * auVar82._0_4_;
            auVar93._4_4_ = fVar126 * auVar77._4_4_ + fVar85 * auVar82._4_4_;
            auVar93._8_4_ = fVar127 * auVar77._8_4_ + fVar15 * auVar82._8_4_;
            auVar93._12_4_ = fVar128 * auVar77._12_4_ + fVar16 * auVar82._12_4_;
            auVar100._0_4_ = fVar102 * auVar77._0_4_ + fVar112 * auVar82._0_4_;
            auVar100._4_4_ = fVar103 * auVar77._4_4_ + fVar95 * auVar82._4_4_;
            auVar100._8_4_ = fVar104 * auVar77._8_4_ + fVar96 * auVar82._8_4_;
            auVar100._12_4_ = fVar120 * auVar77._12_4_ + fVar97 * auVar82._12_4_;
LAB_01338ebd:
            auVar82 = ZEXT816(0) << 0x20;
          }
          else {
            lVar34 = *(long *)(lVar54 + lVar33 + 0x38);
            lVar14 = *(long *)(lVar54 + lVar33 + 0x48);
            auVar77 = *(undefined1 (*) [16])(lVar34 + lVar14 * uVar63);
            auVar86 = *(undefined1 (*) [16])(lVar34 + lVar14 * uVar61);
            auVar69 = *(undefined1 (*) [16])(lVar34 + lVar14 * uVar45);
            auVar78 = *(undefined1 (*) [16])(lVar34 + lVar14 * uVar60);
            auVar87 = vminps_avx(auVar77,auVar86);
            auVar65 = vminps_avx(auVar69,auVar78);
            auVar65 = vminps_avx(auVar87,auVar65);
            auVar77 = vmaxps_avx(auVar77,auVar86);
            auVar86 = vmaxps_avx(auVar69,auVar78);
            auVar87 = vmaxps_avx(auVar77,auVar86);
            lVar34 = *(long *)(lVar37 + lVar33 + -0x38);
            lVar14 = *(long *)(lVar37 + lVar33 + -0x28);
            auVar77 = *(undefined1 (*) [16])(lVar34 + lVar14 * uVar63);
            auVar86 = *(undefined1 (*) [16])(lVar34 + lVar14 * uVar61);
            auVar69 = *(undefined1 (*) [16])(lVar34 + lVar14 * uVar45);
            auVar78 = *(undefined1 (*) [16])(lVar34 + lVar14 * uVar60);
            auVar75 = vminps_avx(auVar77,auVar86);
            auVar76 = vminps_avx(auVar69,auVar78);
            auVar75 = vminps_avx(auVar75,auVar76);
            auVar77 = vmaxps_avx(auVar77,auVar86);
            auVar86 = vmaxps_avx(auVar69,auVar78);
            auVar77 = vmaxps_avx(auVar77,auVar86);
            auVar82 = vmaxss_avx(auVar82,ZEXT816(0) << 0x20);
            auVar86 = vshufps_avx(auVar82,auVar82,0);
            auVar82 = ZEXT416((uint)(1.0 - auVar82._0_4_));
            auVar82 = vshufps_avx(auVar82,auVar82,0);
            auVar83._0_4_ = fVar121 * auVar82._0_4_ + auVar65._0_4_ * auVar86._0_4_;
            auVar83._4_4_ = fVar126 * auVar82._4_4_ + auVar65._4_4_ * auVar86._4_4_;
            auVar83._8_4_ = fVar127 * auVar82._8_4_ + auVar65._8_4_ * auVar86._8_4_;
            auVar83._12_4_ = fVar128 * auVar82._12_4_ + auVar65._12_4_ * auVar86._12_4_;
            auVar105._0_4_ = fVar102 * auVar82._0_4_ + auVar86._0_4_ * auVar87._0_4_;
            auVar105._4_4_ = fVar103 * auVar82._4_4_ + auVar86._4_4_ * auVar87._4_4_;
            auVar105._8_4_ = fVar104 * auVar82._8_4_ + auVar86._8_4_ * auVar87._8_4_;
            auVar105._12_4_ = fVar120 * auVar82._12_4_ + auVar86._12_4_ * auVar87._12_4_;
            auVar82 = vmaxss_avx(ZEXT416((uint)(fVar98 - fVar106)),ZEXT816(0) << 0x20);
            auVar86 = vshufps_avx(auVar82,auVar82,0);
            auVar82 = ZEXT416((uint)(1.0 - auVar82._0_4_));
            auVar82 = vshufps_avx(auVar82,auVar82,0);
            auVar93._0_4_ = auVar82._0_4_ * fVar134 + auVar75._0_4_ * auVar86._0_4_;
            auVar93._4_4_ = auVar82._4_4_ * fVar85 + auVar75._4_4_ * auVar86._4_4_;
            auVar93._8_4_ = auVar82._8_4_ * fVar15 + auVar75._8_4_ * auVar86._8_4_;
            auVar93._12_4_ = auVar82._12_4_ * fVar16 + auVar75._12_4_ * auVar86._12_4_;
            auVar100._0_4_ = auVar82._0_4_ * fVar112 + auVar86._0_4_ * auVar77._0_4_;
            auVar100._4_4_ = auVar82._4_4_ * fVar95 + auVar86._4_4_ * auVar77._4_4_;
            auVar100._8_4_ = auVar82._8_4_ * fVar96 + auVar86._8_4_ * auVar77._8_4_;
            auVar100._12_4_ = auVar82._12_4_ * fVar97 + auVar86._12_4_ * auVar77._12_4_;
            uVar57 = iVar4 + 1;
            if ((int)uVar31 <= (int)uVar57) goto LAB_01338ebd;
            plVar62 = (long *)(lVar33 + (ulong)uVar57 * 0x38 + 0x10);
            auVar82 = ZEXT816(0) << 0x20;
            do {
              auVar110._0_4_ = ((float)(int)uVar57 / fVar74 - fVar90) / (fVar115 - fVar90);
              auVar110._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar77 = vshufps_avx(auVar110,auVar110,0);
              fVar95 = auVar93._4_4_;
              fVar96 = auVar93._8_4_;
              fVar97 = auVar93._12_4_;
              auVar86 = vshufps_avx(ZEXT416((uint)(1.0 - auVar110._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar110._0_4_)),0);
              fVar85 = auVar83._4_4_;
              fVar15 = auVar83._8_4_;
              fVar98 = auVar83._12_4_;
              auVar117._0_4_ = auVar93._0_4_ * auVar77._0_4_ + auVar86._0_4_ * auVar83._0_4_;
              auVar117._4_4_ = fVar95 * auVar77._4_4_ + auVar86._4_4_ * fVar85;
              auVar117._8_4_ = fVar96 * auVar77._8_4_ + auVar86._8_4_ * fVar15;
              auVar117._12_4_ = fVar97 * auVar77._12_4_ + auVar86._12_4_ * fVar98;
              fVar102 = auVar100._4_4_;
              fVar103 = auVar100._8_4_;
              fVar104 = auVar100._12_4_;
              fVar106 = auVar105._4_4_;
              fVar16 = auVar105._8_4_;
              fVar112 = auVar105._12_4_;
              auVar111._0_4_ = auVar86._0_4_ * auVar105._0_4_ + auVar100._0_4_ * auVar77._0_4_;
              auVar111._4_4_ = auVar86._4_4_ * fVar106 + fVar102 * auVar77._4_4_;
              auVar111._8_4_ = auVar86._8_4_ * fVar16 + fVar103 * auVar77._8_4_;
              auVar111._12_4_ = auVar86._12_4_ * fVar112 + fVar104 * auVar77._12_4_;
              lVar34 = plVar62[-2];
              lVar33 = *plVar62;
              auVar77 = *(undefined1 (*) [16])(lVar34 + lVar33 * uVar63);
              auVar86 = *(undefined1 (*) [16])(lVar34 + lVar33 * uVar61);
              auVar69 = *(undefined1 (*) [16])(lVar34 + lVar33 * uVar45);
              auVar78 = *(undefined1 (*) [16])(lVar34 + lVar33 * uVar60);
              auVar87 = vminps_avx(auVar77,auVar86);
              auVar65 = vminps_avx(auVar69,auVar78);
              auVar87 = vminps_avx(auVar87,auVar65);
              auVar87 = vsubps_avx(auVar87,auVar117);
              auVar77 = vmaxps_avx(auVar77,auVar86);
              auVar86 = vmaxps_avx(auVar69,auVar78);
              auVar77 = vmaxps_avx(auVar77,auVar86);
              auVar86 = vsubps_avx(auVar77,auVar111);
              auVar77 = vminps_avx(auVar87,auVar82);
              auVar83._0_4_ = auVar77._0_4_ + auVar83._0_4_;
              auVar83._4_4_ = auVar77._4_4_ + fVar85;
              auVar83._8_4_ = auVar77._8_4_ + fVar15;
              auVar83._12_4_ = auVar77._12_4_ + fVar98;
              auVar93._0_4_ = auVar77._0_4_ + auVar93._0_4_;
              auVar93._4_4_ = auVar77._4_4_ + fVar95;
              auVar93._8_4_ = auVar77._8_4_ + fVar96;
              auVar93._12_4_ = auVar77._12_4_ + fVar97;
              auVar77 = vmaxps_avx(auVar86,auVar82);
              auVar105._0_4_ = auVar105._0_4_ + auVar77._0_4_;
              auVar105._4_4_ = fVar106 + auVar77._4_4_;
              auVar105._8_4_ = fVar16 + auVar77._8_4_;
              auVar105._12_4_ = fVar112 + auVar77._12_4_;
              auVar100._0_4_ = auVar100._0_4_ + auVar77._0_4_;
              auVar100._4_4_ = fVar102 + auVar77._4_4_;
              auVar100._8_4_ = fVar103 + auVar77._8_4_;
              auVar100._12_4_ = fVar104 + auVar77._12_4_;
              uVar57 = uVar57 + 1;
              plVar62 = plVar62 + 7;
            } while (uVar31 != uVar57);
          }
          auVar135 = ZEXT1664(auVar82);
          auVar68 = vminps_avx(auVar68,auVar83);
          auVar81 = vmaxps_avx(auVar81,auVar105);
          auVar71 = vminps_avx(auVar71,auVar93);
          auVar66 = vmaxps_avx(auVar66,auVar100);
          lVar32 = lVar32 + 1;
          auVar132 = ZEXT1664(ZEXT816(0) << 0x40);
        } while (lVar32 != 4);
        local_1e28 = vmaxps_avx(local_1e28,auVar66);
        local_1d98 = vminps_avx(local_1d98,auVar71);
        local_1e18 = vmaxps_avx(local_1e18,auVar81);
        auVar70 = vminps_avx(auVar70,auVar68);
        local_1e40 = (HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::avx::RecalculatePrimRef<embree::QuadMesh>,_2UL>
                      *)((long)local_1e40 + 1);
      } while (local_1e40 !=
               (HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::avx::RecalculatePrimRef<embree::QuadMesh>,_2UL>
                *)(uVar51 + (uVar51 == 0)));
    }
    (local_1de8->ref).ptr = uVar36 | (ulong)pcVar50 | 8;
    *(undefined1 (*) [16])(local_1de8->lbounds).bounds0.lower.field_0.m128 = auVar70;
    *(undefined8 *)&(local_1de8->lbounds).bounds0.upper.field_0 = local_1e18._0_8_;
    *(undefined8 *)((long)&(local_1de8->lbounds).bounds0.upper.field_0 + 8) = local_1e18._8_8_;
    *(undefined8 *)&(local_1de8->lbounds).bounds1.lower.field_0 = local_1d98._0_8_;
    *(undefined8 *)((long)&(local_1de8->lbounds).bounds1.lower.field_0 + 8) = local_1d98._8_8_;
    *(undefined8 *)&(local_1de8->lbounds).bounds1.upper.field_0 = local_1e28._0_8_;
    *(undefined8 *)((long)&(local_1de8->lbounds).bounds1.upper.field_0 + 8) = local_1e28._8_8_;
    local_1de8->dt = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
    return local_1de8;
  }
  lVar42 = 0xbc;
  do {
    *(undefined8 *)((long)&current.split.mapping.scale.field_0 + lVar42 + 4) = 0xffffffff7f800000;
    *(undefined8 *)((long)&current.split.mapping.scale.field_0 + lVar42 + 0xc) = 0;
    lVar42 = lVar42 + 0xf0;
  } while (lVar42 != 0xfbc);
  local_848 = 1;
  local_640 = 1;
  geomID.field_0.v[0] = uVar51;
  local_17b8 = local_1df8;
  aVar29 = local_17b8;
  local_1798 = local_1e58;
  local_1788 = _local_1e38;
  local_1778 = local_1e08;
  local_1758 = pBVar49;
  aStack_1750._M_b._M_p = (__base_type)(__base_type)_Var6._M_p;
  sStack_1748 = values[0].ref.ptr;
  sStack_1740 = values[0]._8_8_;
  local_1738.lower = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  local_1738.upper = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  fStack_1730 = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  uStack_172c = values[0].lbounds.bounds0.lower.field_0._12_4_;
  local_1728[0] = BVar43;
  local_17b8.m128[0] = (float)(int)uVar73;
  local_17b8.m128[1] = (float)SUB84(uVar73,4);
  local_1708 = (int)local_17b8.m128[0];
  aiStack_1704[0] = (int)local_17b8.m128[1];
  local_16f8 = local_17a8._0_8_;
  uStack_16f0 = local_17a8._8_8_;
  local_840 = BVar43;
  local_838[0] = 2;
  local_8c8[0] = &local_840;
  local_1e38 = (undefined1  [8])&local_1b68;
  local_1e08._0_8_ = &local_1a78;
  local_1e40 = &this->heuristicTemporalSplit;
  local_1de0 = &pMStack_1b98;
  local_1dc8._8_4_ = 0x7f800000;
  local_1dc8._0_8_ = 0x7f8000007f800000;
  local_1dc8._12_4_ = 0x7f800000;
  local_1df8.m128[2] = -INFINITY;
  local_1df8._0_8_ = 0xff800000ff800000;
  local_1df8.m128[3] = -INFINITY;
  bVar55 = 0;
  local_17b8 = aVar29;
  local_17a8 = aVar22;
  local_1768 = aVar23;
  do {
    if (local_848 == 0) goto LAB_01337d58;
    lVar42 = -1;
    ppBVar48 = &local_1758;
    uVar51 = 0;
    uVar53 = 0;
    do {
      uVar60 = (long)ppBVar48[1] - (long)*ppBVar48;
      if ((((this->cfg).maxLeafSize < uVar60) || (1 < *(uint *)((long)ppBVar48 + 0x4c))) ||
         (bVar52 != 0)) {
        if (uVar51 < uVar60) {
          lVar42 = uVar53;
          uVar51 = uVar60;
        }
        bVar52 = 0;
      }
      uVar53 = uVar53 + 1;
      ppBVar48 = ppBVar48 + 0x1e;
    } while (local_848 != uVar53);
    if (lVar42 == -1) goto LAB_01337d0e;
    lVar32 = lVar42 * 0xf0;
    v0.field_0.v[0] = current.super_BuildRecord.depth + 1;
    local_1b68 = 0xffffffff7f800000;
    uStack_1b60 = 0;
    v1.field_0.v[0] = current.super_BuildRecord.depth + 1;
    local_1a78 = 0xffffffff7f800000;
    uStack_1a70 = 0;
    pSVar3 = (Split *)(local_1718 + lVar32);
    iVar4 = aiStack_1704[(lVar42 * 0x1e + -1) * 2];
    local_1e58._0_8_ = &(&geomID)[lVar42 * 0xf].field_0;
    if (iVar4 == 0) {
      pBVar49 = (&local_1758)[lVar42 * 0x1e];
      pBVar58 = (&aStack_1750)[lVar42 * 0x1e]._M_b._M_p;
      v2.field_0.i[2] = 0x7f800000;
      v2.field_0.v[0] = 0x7f8000007f800000;
      v2.field_0.i[3] = 0x7f800000;
      aStack_1cd8.m128[0] = -INFINITY;
      aStack_1cd8.m128[1] = -INFINITY;
      aStack_1cd8.m128[2] = -INFINITY;
      aStack_1cd8.m128[3] = -INFINITY;
      local_1cc8.m128[0] = INFINITY;
      local_1cc8.m128[1] = INFINITY;
      local_1cc8.m128[2] = INFINITY;
      local_1cc8.m128[3] = INFINITY;
      aStack_1cb8.m128[0] = -INFINITY;
      aStack_1cb8.m128[1] = -INFINITY;
      aStack_1cb8.m128[2] = -INFINITY;
      aStack_1cb8.m128[3] = -INFINITY;
      local_1ca8.m128[0] = INFINITY;
      local_1ca8.m128[1] = INFINITY;
      local_1ca8.m128[2] = INFINITY;
      local_1ca8.m128[3] = INFINITY;
      aStack_1c98.m128[0] = -INFINITY;
      aStack_1c98.m128[1] = -INFINITY;
      aStack_1c98.m128[2] = -INFINITY;
      aStack_1c98.m128[3] = -INFINITY;
      local_1c68 = 0.0;
      local_1c88 = (__pointer_type)0x0;
      pBStack_1c80 = (__pointer_type)0x0;
      pMStack_1c78 = (MemoryMonitorInterface *)0x0;
      pMStack_1c70 = (MemoryMonitorInterface *)0x0;
      auVar91._8_4_ = 0x3f800000;
      auVar91._0_8_ = 0x3f8000003f800000;
      auVar91._12_4_ = 0x3f800000;
      lVar34 = vmovlps_avx(auVar91);
      fStack_1c64 = (float)lVar34;
      fStack_1c60 = (float)((ulong)lVar34 >> 0x20);
      fStack_1c5c = 0.0;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[2]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[3]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[0]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[1]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
           -INFINITY;
      right.max_time_range.lower = 0.0;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      uVar53 = vmovlps_avx(auVar91);
      right.max_time_range.upper = (float)uVar53;
      right.time_range.lower = (float)((ulong)uVar53 >> 0x20);
      right.time_range.upper = 0.0;
      vSplitPos.field_0.i[1] = *(undefined4 *)(local_1718 + lVar32 + 8);
      vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
      lVar33 = (long)(1 << (local_1718[lVar32 + 4] & 0x1f)) * 0x10;
      vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar33);
      vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar33 + 8);
      isLeft.vSplitPos = &vSplitPos;
      isLeft.vSplitMask = &vSplitMask;
      isLeft.split = pSVar3;
      pBStack_1ba0 = (__pointer_type)
                     parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                               (*(PrimRefMB **)((long)local_1728[lVar42 * 0x1e] + 0x20),
                                (size_t)pBVar49,(size_t)pBVar58,(EmptyTy *)local_19e8,
                                (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&v2,&right,&isLeft,
                                &reduction,&reduction2,0x80,0xc00);
      BVar43 = local_1728[lVar42 * 0x1e];
      auVar65._8_8_ = 0;
      auVar65._0_4_ = local_1728[lVar42 * 0x1e + -1].lower;
      auVar65._4_4_ = local_1728[lVar42 * 0x1e + -1].upper;
      aStack_1bf8._0_8_ = -0x7fffff00800000;
      aStack_1bf8._8_8_ = -0x7fffff00800000;
      local_1be8._0_8_ = 0x7f8000007f800000;
      local_1be8._8_8_ = 0x7f8000007f800000;
      aStack_1bd8._0_8_ = -0x7fffff00800000;
      aStack_1bd8._8_8_ = -0x7fffff00800000;
      local_1bc8.m128[0] = INFINITY;
      local_1bc8.m128[1] = INFINITY;
      local_1bc8._8_8_ = 0x7f8000007f800000;
      aStack_1bb8._0_8_ = -0x7fffff00800000;
      aStack_1bb8._8_8_ = -0x7fffff00800000;
      local_1c08._0_8_ = v2.field_0.v[0];
      local_1c08._8_8_ = v2.field_0.v[1];
      *local_1de0 = (MemoryMonitorInterface *)0x0;
      local_1de0[1] = (MemoryMonitorInterface *)0x0;
      local_1de0[2] = (MemoryMonitorInterface *)(lVar34 << 0x20);
      local_1de0[3] = (MemoryMonitorInterface *)(ulong)(uint)fStack_1c60;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = auStack_1b88._8_8_;
      auVar66 = vcmpps_avx(auVar75,auVar65,1);
      auVar68 = vinsertps_avx(auVar65,auVar75,0x50);
      auVar67 = vinsertps_avx(auVar75,auVar65,0x50);
      auVar66 = vblendvps_avx(auVar67,auVar68,auVar66);
      uVar53 = vmovlps_avx(auVar66);
      auStack_1b88._8_8_ = uVar53;
      local_1b18._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      local_1b18._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      uStack_1b00 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
                             .upper.field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
                             .upper.field_0.m128[2]);
      uStack_1b08 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0._0_8_;
      local_1af8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                            lower.field_0.m128[1],
                            right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                            lower.field_0.m128[0]);
      uStack_1af0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .lower.field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .lower.field_0.m128[2]);
      uStack_1ae8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[1],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[0]);
      uStack_1ae0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[2]);
      local_1ad8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                            field_0.m128[1],
                            right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                            field_0.m128[0]);
      uStack_1ad0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                             field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                             field_0.m128[2]);
      uStack_1ac8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[1],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[0]);
      uStack_1ac0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[2]);
      auVar76._8_8_ = 0;
      auVar76._0_8_ = auStack_1a98._8_8_;
      auVar66 = vcmpps_avx(auVar76,auVar65,1);
      auVar68 = vinsertps_avx(auVar65,auVar76,0x50);
      auVar67 = vinsertps_avx(auVar76,auVar65,0x50);
      auVar66 = vblendvps_avx(auVar67,auVar68,auVar66);
      uVar53 = vmovlps_avx(auVar66);
      auStack_1a98._8_8_ = uVar53;
      pBVar136 = this;
      local_1ba8 = pBVar49;
      local_1b78 = BVar43;
      local_1ab8 = pBStack_1ba0;
      pBStack_1ab0 = pBVar58;
      local_1a88 = BVar43;
LAB_01337039:
      local_1e60.lower = 0.0;
      local_1e60.upper = 0.0;
      bVar64 = false;
    }
    else {
      this_01 = &local_17b8 + lVar42 * 0xf;
      local_1e28._0_8_ = this_01;
      if (iVar4 != 2) {
        if (iVar4 == 1) {
          SetMB::deterministic_order((SetMB *)&this_01->field_1);
          splitFallback(this,(SetMB *)local_1e28._0_8_,(SetMB *)local_1c08,
                        (SetMB *)&local_1b18.field_1);
          pBVar136 = this;
        }
        else {
          pBVar136 = this;
          if (iVar4 == 3) {
            SetMB::deterministic_order((SetMB *)&this_01->field_1);
            splitByGeometry(this,(SetMB *)local_1e28._0_8_,(SetMB *)local_1c08,
                            (SetMB *)&local_1b18.field_1);
            pBVar136 = this;
          }
        }
        goto LAB_01337039;
      }
      time_range1.lower = *(float *)(local_1718 + lVar32 + 8);
      time_range0.lower = local_1728[lVar42 * 0x1e + -1].lower;
      time_range1.upper = local_1728[lVar42 * 0x1e + -1].upper;
      local_1e18._0_4_ = local_1728[lVar42 * 0x1e].lower;
      local_1e18._4_4_ = local_1728[lVar42 * 0x1e].upper;
      time_range0.upper = time_range1.lower;
      BVar43 = (BBox1f)operator_new(0x28);
      pMVar7 = local_1e40->device;
      pBVar49 = (&aStack_1750)[lVar42 * 0x1e]._M_b._M_p;
      *(MemoryMonitorInterface **)BVar43 = pMVar7;
      *(undefined1 *)((long)BVar43 + 8) = 0;
      *(long *)((long)BVar43 + 0x10) = 0;
      *(long *)((long)BVar43 + 0x18) = 0;
      *(long *)((long)BVar43 + 0x20) = 0;
      lVar34 = (long)pBVar49 - (long)(&local_1758)[lVar42 * 0x1e];
      pBVar58 = pBVar49;
      pBVar136 = this;
      if (lVar34 != 0) {
        uVar51 = lVar34 * 0x50;
        (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,uVar51,0);
        if (uVar51 < 0x1c00000) {
          pvVar35 = alignedMalloc(uVar51,0x10);
        }
        else {
          pvVar35 = os_malloc(uVar51,(bool *)((long)BVar43 + 8));
        }
        *(void **)((long)BVar43 + 0x20) = pvVar35;
        *(long *)((long)BVar43 + 0x10) = lVar34;
        *(long *)((long)BVar43 + 0x18) = lVar34;
        pBVar49 = *(__pointer_type *)(local_1e58._0_8_ + 0x70);
        pBVar58 = *(__pointer_type *)(local_1e58._0_8_ + 0x78);
        pBVar136 = this;
      }
      pvVar25 = isLeft.vSplitPos;
      vSplitMask.field_0._0_8_ = local_1e18._0_8_;
      vSplitMask.field_0._8_8_ = &time_range0;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[2]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[3]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[0]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[1]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
           -INFINITY;
      right.max_time_range.lower = 0.0;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      auVar66._8_4_ = 0x3f800000;
      auVar66._0_8_ = 0x3f8000003f800000;
      auVar66._12_4_ = 0x3f800000;
      uVar53 = vmovlps_avx(auVar66);
      right.max_time_range.upper = (float)uVar53;
      right.time_range.lower = (float)((ulong)uVar53 >> 0x20);
      right.time_range.upper = 0.0;
      local_1e60 = BVar43;
      if ((ulong)((long)pBVar58 - (long)pBVar49) < 0xc00) {
        isLeft.split = (Split *)pBVar49;
        isLeft.vSplitPos = (vint *)pBVar58;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  ((PrimInfoMB *)&v2,(anon_class_40_5_808acc65 *)&vSplitMask,
                   (range<unsigned_long> *)&isLeft);
      }
      else {
        isLeft.vSplitPos._6_2_ = SUB82(pvVar25,6);
        isLeft.vSplitPos._0_6_ = CONCAT15(4,CONCAT14(1,isLeft.vSplitPos._0_4_));
        tbb::detail::r1::initialize((task_group_context *)&isLeft);
        _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        vSplitPos.field_0.v[0] = (longlong)pBVar58;
        vSplitPos.field_0.v[1] = (longlong)pBVar49;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMB *)&v2,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&right,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                   (anon_class_16_2_ed117de8_conflict29 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&isLeft,(task_group_context *)pBVar136);
        cVar30 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
        if (cVar30 != '\0') {
          prVar40 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar40,"task cancelled");
          __cxa_throw(prVar40,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::r1::destroy((task_group_context *)&isLeft);
      }
      lVar34 = *(long *)(local_1e58._0_8_ + 0x70);
      pcVar59 = *(code **)(local_1e58._0_8_ + 0x78);
      uVar51 = (long)pcVar59 - lVar34;
      if ((long)pBStack_1c80 - (long)local_1c88 != uVar51) {
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = &time_range0;
        pBStack_1c80 = (__pointer_type)
                       parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                 (*(PrimRefMB **)((long)BVar43 + 0x20),0,uVar51,0x400,
                                  (anon_class_8_1_41ce32a5 *)&right);
        lVar34 = *(long *)(local_1e58._0_8_ + 0x70);
        pcVar59 = *(code **)(local_1e58._0_8_ + 0x78);
        uVar51 = (long)pcVar59 - lVar34;
      }
      auVar67._4_4_ = time_range0.upper;
      auVar67._0_4_ = time_range0.lower;
      auVar67._8_8_ = 0;
      aStack_1bf8._0_8_ = CONCAT44(aStack_1cd8.m128[1],aStack_1cd8.m128[0]);
      aStack_1bf8._8_8_ = CONCAT44(aStack_1cd8.m128[3],aStack_1cd8.m128[2]);
      local_1be8._0_8_ = CONCAT44(local_1cc8.m128[1],local_1cc8.m128[0]);
      local_1be8._8_8_ = CONCAT44(local_1cc8.m128[3],local_1cc8.m128[2]);
      aStack_1bd8._0_8_ = CONCAT44(aStack_1cb8.m128[1],aStack_1cb8.m128[0]);
      aStack_1bd8._8_8_ = CONCAT44(aStack_1cb8.m128[3],aStack_1cb8.m128[2]);
      local_1bc8.m128[1] = local_1ca8.m128[1];
      local_1bc8.m128[0] = local_1ca8.m128[0];
      local_1bc8._8_8_ = CONCAT44(local_1ca8.m128[3],local_1ca8.m128[2]);
      aStack_1bb8._0_8_ = CONCAT44(aStack_1c98.m128[1],aStack_1c98.m128[0]);
      aStack_1bb8._8_8_ = CONCAT44(aStack_1c98.m128[3],aStack_1c98.m128[2]);
      *local_1de0 = pMStack_1c78;
      local_1de0[1] = pMStack_1c70;
      uVar53 = vSplitPos.field_0.v[1];
      local_1c08._0_8_ = v2.field_0.v[0];
      local_1c08._8_8_ = v2.field_0.v[1];
      local_1ba8 = local_1c88;
      auVar77._4_4_ = fStack_1c64;
      auVar77._0_4_ = local_1c68;
      auVar77._8_8_ = 0;
      auVar86._4_4_ = fStack_1c5c;
      auVar86._0_4_ = fStack_1c60;
      auVar86._8_8_ = 0;
      auVar66 = vcmpps_avx(auVar86,auVar67,1);
      auVar68 = vinsertps_avx(auVar67,auVar86,0x50);
      auVar67 = vinsertps_avx(auVar86,auVar67,0x50);
      auVar66 = vblendvps_avx(auVar67,auVar68,auVar66);
      auStack_1b88 = vmovlhps_avx(auVar77,auVar66);
      _reduction2 = local_1e18._0_8_;
      isLeft.split = (Split *)0x7f8000007f800000;
      isLeft.vSplitPos = (vint *)0x7f8000007f800000;
      isLeft.vSplitMask = (vbool *)0xff800000ff800000;
      auVar68._8_4_ = 0x3f800000;
      auVar68._0_8_ = 0x3f8000003f800000;
      auVar68._12_4_ = 0x3f800000;
      vmovlps_avx(auVar68);
      pBStack_1ba0 = pBStack_1c80;
      local_1b78 = BVar43;
      if (uVar51 < 0xc00) {
        vSplitPos.field_0.v[0] = lVar34;
        vSplitPos.field_0.v[1] = (longlong)pcVar59;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  (&right,(anon_class_24_3_35f68c7c *)&reduction2,(range<unsigned_long> *)&vSplitPos
                  );
      }
      else {
        vSplitPos.field_0.v[1]._4_1_ = 1;
        vSplitPos.field_0.v[1]._6_2_ = SUB82(uVar53,6);
        vSplitPos.field_0.v[1]._5_1_ = 4;
        tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
        local_19e8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_19e8._8_8_ = &reduction2;
        _reduction = pcVar59;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  (&right,(d1 *)&reduction,(blocked_range<unsigned_long> *)&isLeft,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_19e8,
                   (anon_class_16_2_ed117de8_conflict30 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&vSplitPos,(task_group_context *)pBVar136);
        cVar30 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
        if (cVar30 != '\0') {
          prVar40 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar40,"task cancelled");
          __cxa_throw(prVar40,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
      }
      lVar34 = right.object_range._end - right.object_range._begin;
      right.object_range._begin = *(unsigned_long *)(local_1e58._0_8_ + 0x70);
      right.object_range._end = lVar34 + right.object_range._begin;
      if (lVar34 != *(unsigned_long *)(local_1e58._0_8_ + 0x78) - right.object_range._begin) {
        isLeft.split = (Split *)&time_range1;
        right.object_range._end =
             parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                       (*(PrimRefMB **)(local_1e18._0_8_ + 0x20),right.object_range._begin,
                        *(unsigned_long *)(local_1e58._0_8_ + 0x78),0x400,
                        (anon_class_8_1_41ce32a6 *)&isLeft);
      }
      auVar82 = local_1e18;
      auVar69._4_4_ = time_range1.upper;
      auVar69._0_4_ = time_range1.lower;
      auVar69._8_8_ = 0;
      local_1b18._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      local_1b18._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      uStack_1b08 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0._0_8_;
      uStack_1b00 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
                             .upper.field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
                             .upper.field_0.m128[2]);
      local_1af8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                            lower.field_0.m128[1],
                            right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                            lower.field_0.m128[0]);
      uStack_1af0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .lower.field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .lower.field_0.m128[2]);
      uStack_1ae8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[1],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[0]);
      uStack_1ae0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[2]);
      local_1ad8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                            field_0.m128[1],
                            right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                            field_0.m128[0]);
      uStack_1ad0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                             field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                             field_0.m128[2]);
      uStack_1ac8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[1],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[0]);
      uStack_1ac0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[2]);
      auVar78._4_4_ = right.max_time_range.upper;
      auVar78._0_4_ = right.max_time_range.lower;
      auVar78._8_8_ = 0;
      auVar87._4_4_ = right.time_range.upper;
      auVar87._0_4_ = right.time_range.lower;
      auVar87._8_8_ = 0;
      auVar66 = vcmpps_avx(auVar87,auVar69,1);
      auVar68 = vinsertps_avx(auVar69,auVar87,0x50);
      auVar67 = vinsertps_avx(auVar87,auVar69,0x50);
      auVar66 = vblendvps_avx(auVar67,auVar68,auVar66);
      auStack_1a98 = vmovlhps_avx(auVar78,auVar66);
      local_1a88.lower = (float)local_1e18._0_4_;
      local_1a88.upper = (float)local_1e18._4_4_;
      bVar64 = local_1e60 != (BBox1f)0x0;
      local_1e18 = auVar82;
      local_1ab8 = (__pointer_type)right.object_range._begin;
      pBStack_1ab0 = (__pointer_type)right.object_range._end;
    }
    uVar53 = &v2;
    this = pBVar136;
    findFallback((Split *)uVar53,pBVar136,(SetMB *)local_1c08);
    *(longlong *)local_1e38 = v2.field_0.v[0];
    *(longlong *)((long)local_1e38 + 8) = v2.field_0.v[1];
    local_1b58 = CONCAT44(aStack_1cd8.m128[1],aStack_1cd8.m128[0]);
    local_1b48 = CONCAT44(local_1cc8.m128[1],local_1cc8.m128[0]);
    lStack_1b40 = CONCAT44(local_1cc8.m128[3],local_1cc8.m128[2]);
    lStack_1b38 = CONCAT44(aStack_1cb8.m128[1],aStack_1cb8.m128[0]);
    lStack_1b30 = CONCAT44(aStack_1cb8.m128[3],aStack_1cb8.m128[2]);
    findFallback((Split *)uVar53,pBVar136,(SetMB *)&local_1b18.field_1);
    lVar34 = local_640;
    *(longlong *)local_1e08._0_8_ = v2.field_0.v[0];
    *(longlong *)(local_1e08._0_8_ + 8) = v2.field_0.v[1];
    local_1a68 = CONCAT44(aStack_1cd8.m128[1],aStack_1cd8.m128[0]);
    local_1a58 = CONCAT44(local_1cc8.m128[1],local_1cc8.m128[0]);
    uStack_1a50 = CONCAT44(local_1cc8.m128[3],local_1cc8.m128[2]);
    uStack_1a48 = CONCAT44(aStack_1cb8.m128[1],aStack_1cb8.m128[0]);
    uStack_1a40 = CONCAT44(aStack_1cb8.m128[3],aStack_1cb8.m128[2]);
    local_1e60 = (BBox1f)0x0;
    pBVar41 = local_8c8[lVar42];
    if (local_1b78 == *pBVar41) {
      pBVar41[1] = (BBox1f)((long)pBVar41[1] + 1);
      BVar43 = local_1b78;
    }
    else {
      local_640 = local_640 + 1;
      uVar53 = &local_840;
      *(BBox1f *)
       ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
         *)(uVar53 + 0x78) + (lVar34 * 2 + -0xf) * 8) = local_1b78;
      local_838[lVar34 * 2] = 1;
      local_8c8[lVar42] =
           (BBox1f *)
           ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
             *)(uVar53 + 0x78) + (lVar34 * 2 + -0xf) * 8);
      BVar43 = *pBVar41;
    }
    lVar42 = local_640;
    if (local_1a88 == BVar43) {
      local_8c8[local_848] = pBVar41;
      BVar43 = pBVar41[1];
      pBVar41[1] = (BBox1f)((long)BVar43 + 1);
    }
    else {
      local_640 = local_640 + 1;
      uVar53 = &local_840;
      *(BBox1f *)
       ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
         *)(uVar53 + 0x78) + (lVar42 * 2 + -0xf) * 8) = local_1a88;
      local_838[lVar42 * 2] = 1;
      local_8c8[local_848] =
           (BBox1f *)
           ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
             *)(uVar53 + 0x78) + (lVar42 * 2 + -0xf) * 8);
      BVar43 = (BBox1f)((long)pBVar41[1] + -1);
    }
    pBVar41[1] = BVar43;
    if (BVar43 == (BBox1f)0x0) {
      uVar53 = *pBVar41;
      if ((BBox1f)uVar53 != (BBox1f)0x0) {
        lVar42 = *(long *)(uVar53 + 0x18);
        pvVar35 = *(void **)&((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                               *)(uVar53 + 0x20))->field_0x0;
        if (pvVar35 != (void *)0x0) {
          if ((ulong)(lVar42 * 0x50) < 0x1c00000) {
            alignedFree(pvVar35);
          }
          else {
            os_free(pvVar35,lVar42 * 0x50,
                    (bool)*(default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                            *)(uVar53 + 8));
          }
        }
        if (lVar42 != 0) {
          (**(code **)**(undefined8 **)uVar53)(*(undefined8 **)uVar53,lVar42 * -0x50,1);
        }
        *(undefined8 *)
         &((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)(uVar53 + 0x10))->field_0x0 = 0;
        *(undefined8 *)(uVar53 + 0x18) = 0;
        *(undefined8 *)
         &((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)(uVar53 + 0x20))->field_0x0 = 0;
      }
      operator_delete((void *)uVar53);
    }
    uVar51 = local_848;
    auVar68 = auStack_1a98;
    auVar66 = auStack_1b88;
    *(longlong *)local_1e58._0_8_ = v0.field_0.v[0];
    *(undefined8 *)(local_1e58._0_8_ + 0x10) = local_1c08._0_8_;
    *(undefined8 *)(local_1e58._0_8_ + 0x18) = local_1c08._8_8_;
    *(undefined8 *)(local_1e58._0_8_ + 0x20) = aStack_1bf8._0_8_;
    *(undefined8 *)(local_1e58._0_8_ + 0x28) = aStack_1bf8._8_8_;
    *(undefined8 *)(local_1e58._0_8_ + 0x30) = local_1be8._0_8_;
    *(undefined8 *)(local_1e58._0_8_ + 0x38) = local_1be8._8_8_;
    *(undefined8 *)(local_1e58._0_8_ + 0x40) = aStack_1bd8._0_8_;
    *(undefined8 *)(local_1e58._0_8_ + 0x48) = aStack_1bd8._8_8_;
    ((BBox1f *)(local_1e58._0_8_ + 0x50))->lower = (float)local_1bc8._0_4_;
    ((BBox1f *)(local_1e58._0_8_ + 0x50))->upper = local_1bc8.m128[1];
    *(undefined8 *)(local_1e58._0_8_ + 0x58) = local_1bc8._8_8_;
    *(undefined8 *)(local_1e58._0_8_ + 0x60) = aStack_1bb8._0_8_;
    *(undefined8 *)(local_1e58._0_8_ + 0x68) = aStack_1bb8._8_8_;
    *(__pointer_type *)(local_1e58._0_8_ + 0x70) = local_1ba8;
    *(__pointer_type *)(local_1e58._0_8_ + 0x78) = pBStack_1ba0;
    *(MemoryMonitorInterface **)(local_1e58._0_8_ + 0x80) = pMStack_1b98;
    *(size_t *)(local_1e58._0_8_ + 0x88) = sStack_1b90;
    ((BBox1f *)(local_1e58._0_8_ + 0x90))->lower = (float)auStack_1b88._0_4_;
    ((BBox1f *)(local_1e58._0_8_ + 0x90))->upper = (float)auStack_1b88._4_4_;
    ((BBox1f *)(local_1e58._0_8_ + 0x98))->lower = (float)auStack_1b88._8_4_;
    ((BBox1f *)(local_1e58._0_8_ + 0x98))->upper = (float)auStack_1b88._12_4_;
    *(BBox1f *)(local_1e58._0_8_ + 0xa0) = local_1b78;
    uVar73 = *(undefined8 *)local_1e38;
    uVar17 = *(undefined8 *)((long)local_1e38 + 8);
    pSVar3->sah = (float)(int)uVar73;
    pSVar3->dim = (int)((ulong)uVar73 >> 0x20);
    *(undefined8 *)(local_1718 + lVar32 + 8) = uVar17;
    *(longlong *)(local_1e58._0_8_ + 0xc0) = local_1b58;
    *(longlong *)(local_1e58._0_8_ + 0xd0) = local_1b48;
    *(longlong *)(local_1e58._0_8_ + 0xd8) = lStack_1b40;
    *(longlong *)(local_1e58._0_8_ + 0xe0) = lStack_1b38;
    *(longlong *)(local_1e58._0_8_ + 0xe8) = lStack_1b30;
    lVar42 = local_848 * 0xf0;
    (&geomID)[local_848 * 0xf].field_0.v[0] = v1.field_0.v[0];
    *(undefined8 *)(&local_17b8 + uVar51 * 0xf) = local_1b18._0_8_;
    *(undefined8 *)((long)&local_17b8 + lVar42 + 8) = local_1b18._8_8_;
    *(undefined8 *)((long)&local_17a8 + uVar51 * 0xf0) = uStack_1b08;
    *(undefined8 *)((long)&local_17a8 + uVar51 * 0xf0 + 8) = uStack_1b00;
    *(undefined8 *)(&local_1798 + uVar51 * 0xf) = local_1af8;
    *(undefined8 *)((long)&local_1798 + lVar42 + 8) = uStack_1af0;
    *(undefined8 *)(&local_1788 + uVar51 * 0xf) = uStack_1ae8;
    *(undefined8 *)((long)&local_1788 + lVar42 + 8) = uStack_1ae0;
    *(undefined8 *)((long)&local_1778 + uVar51 * 0xf0) = local_1ad8;
    *(undefined8 *)((long)&local_1778 + uVar51 * 0xf0 + 8) = uStack_1ad0;
    *(undefined8 *)(&local_1768 + uVar51 * 0xf) = uStack_1ac8;
    *(undefined8 *)((long)&local_1768 + lVar42 + 8) = uStack_1ac0;
    (&local_1758)[uVar51 * 0x1e] = local_1ab8;
    (&aStack_1750)[uVar51 * 0x1e]._M_b._M_p = pBStack_1ab0;
    (&aStack_1750)[uVar51 * 0x1e + 1]._M_b._M_p = pBStack_1aa8;
    (&aStack_1750)[uVar51 * 0x1e + 2]._M_b._M_p = pBStack_1aa0;
    (&local_1738)[uVar51 * 0x1e].lower = (float)auStack_1a98._0_4_;
    (&local_1738)[uVar51 * 0x1e].upper = (float)auStack_1a98._4_4_;
    local_1728[uVar51 * 0x1e + -1].lower = (float)auStack_1a98._8_4_;
    local_1728[uVar51 * 0x1e + -1].upper = (float)auStack_1a98._12_4_;
    local_1728[uVar51 * 0x1e] = local_1a88;
    uVar73 = *(undefined8 *)(local_1e08._0_8_ + 8);
    *(undefined8 *)(local_1718 + lVar42) = *(undefined8 *)local_1e08._0_8_;
    *(undefined8 *)(local_1718 + lVar42 + 8) = uVar73;
    *(undefined8 *)((long)&stack0xffffffffffffe8f8 + uVar51 * 0x1e * 8) = local_1a68;
    *(undefined8 *)((long)&stack0xffffffffffffe8f8 + (uVar51 * 0x1e + 2) * 8) = local_1a58;
    *(undefined8 *)((long)local_16e8 + (uVar51 * 0xf + -1) * 0x10 + 8) = uStack_1a50;
    *(undefined8 *)(local_16e8 + uVar51 * 0xf) = uStack_1a48;
    *(undefined8 *)((long)local_16e8 + uVar51 * 0xf0 + 8) = uStack_1a40;
    local_848 = local_848 + 1;
    auStack_1b88 = auVar66;
    auStack_1a98 = auVar68;
    if (local_1e60 != (BBox1f)0x0) {
      uVar53 = &local_1e60;
      std::
      default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
      ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                    *)uVar53,
                   (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                    *)local_1e60);
    }
    bVar55 = bVar55 | bVar64;
  } while (local_848 < (this->cfg).branchingFactor);
  if (local_848 != 0) {
LAB_01337d0e:
    puVar44 = &uStack_172c;
    uVar51 = local_848;
    do {
      auVar66 = vcmpps_avx(ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.lower),
                           ZEXT416(puVar44[-1]),1);
      auVar68 = vcmpps_avx(ZEXT416(*puVar44),
                           ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.upper),1);
      auVar66 = vorps_avx(auVar66,auVar68);
      bVar55 = bVar55 | auVar66[0];
      puVar44 = puVar44 + 0x3c;
      uVar51 = uVar51 - 1;
    } while (uVar51 != 0);
  }
LAB_01337d58:
  pBVar136 = this;
  if ((bVar55 & 1) == 0) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0x1c0;
    pTVar8 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar8->alloc)._M_b._M_p) {
      v1.field_0.v[1]._0_1_ = 1;
      v1.field_0.v[0] = (longlong)pTVar8;
      MutexSys::lock(&pTVar8->mutex);
      if ((pTVar8->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar8->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar8->alloc1).bytesUsed + (pTVar8->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar8->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar8->alloc0).end + (pTVar8->alloc1).end) -
             ((pTVar8->alloc0).cur + (pTVar8->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar8->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar8->alloc1).bytesWasted + (pTVar8->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar72 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar8->alloc0).end = auVar72._0_8_;
      (pTVar8->alloc0).allocBlockSize = auVar72._8_8_;
      (pTVar8->alloc0).bytesUsed = auVar72._16_8_;
      (pTVar8->alloc0).bytesWasted = auVar72._24_8_;
      (pTVar8->alloc0).ptr = (char *)auVar72._0_8_;
      (pTVar8->alloc0).cur = auVar72._8_8_;
      (pTVar8->alloc0).end = auVar72._16_8_;
      (pTVar8->alloc0).allocBlockSize = auVar72._24_8_;
      auVar72 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar8->alloc1).end = auVar72._0_8_;
        (pTVar8->alloc1).allocBlockSize = auVar72._8_8_;
        (pTVar8->alloc1).bytesUsed = auVar72._16_8_;
        (pTVar8->alloc1).bytesWasted = auVar72._24_8_;
        (pTVar8->alloc1).ptr = (char *)auVar72._0_8_;
        (pTVar8->alloc1).cur = auVar72._8_8_;
        (pTVar8->alloc1).end = auVar72._16_8_;
        (pTVar8->alloc1).allocBlockSize = auVar72._24_8_;
      }
      else {
        (pTVar8->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar8->alloc1).ptr = (char *)auVar72._0_8_;
        (pTVar8->alloc1).cur = auVar72._8_8_;
        (pTVar8->alloc1).end = auVar72._16_8_;
        (pTVar8->alloc1).allocBlockSize = auVar72._24_8_;
        (pTVar8->alloc1).end = auVar72._0_8_;
        (pTVar8->alloc1).allocBlockSize = auVar72._8_8_;
        (pTVar8->alloc1).bytesUsed = auVar72._16_8_;
        (pTVar8->alloc1).bytesWasted = auVar72._24_8_;
        (pTVar8->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar8->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      v2.field_0.v[0] = (longlong)pTVar8;
      v0.field_0.v[1]._0_1_ = 1;
      v0.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar9._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar9,(ThreadLocal2 **)&v2);
      }
      else {
        *iVar9._M_current = (ThreadLocal2 *)v2.field_0.v[0];
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if (v1.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)v1.field_0.v[0]);
      }
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar38 = (alloc.talloc0)->cur;
    uVar51 = (ulong)(-(int)sVar38 & 0x1f);
    uVar60 = sVar38 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar51;
    (alloc.talloc0)->cur = uVar60;
    if ((alloc.talloc0)->end < uVar60) {
      (alloc.talloc0)->cur = sVar38;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar50 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        pcVar50 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
        (alloc.talloc0)->ptr = pcVar50;
        sVar38 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar38;
        (alloc.talloc0)->end = v0.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        this = pBVar136;
        if ((ulong)v0.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
          pcVar50 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
          (alloc.talloc0)->ptr = pcVar50;
          sVar38 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar38;
          (alloc.talloc0)->end = v0.field_0.v[0];
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)v0.field_0.v[0] <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar50 = (char *)0x0;
            pBVar136 = this;
            goto LAB_01338162;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar38;
        pBVar136 = this;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar51;
      pcVar50 = (alloc.talloc0)->ptr +
                (uVar60 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_01338162:
    pcVar50[0xc0] = '\0';
    pcVar50[0xc1] = '\0';
    pcVar50[0xc2] = -0x80;
    pcVar50[0xc3] = '\x7f';
    pcVar50[0xc4] = '\0';
    pcVar50[0xc5] = '\0';
    pcVar50[0xc6] = -0x80;
    pcVar50[199] = '\x7f';
    pcVar50[200] = '\0';
    pcVar50[0xc9] = '\0';
    pcVar50[0xca] = -0x80;
    pcVar50[0xcb] = '\x7f';
    pcVar50[0xcc] = '\0';
    pcVar50[0xcd] = '\0';
    pcVar50[0xce] = -0x80;
    pcVar50[0xcf] = '\x7f';
    pcVar50[0xd0] = '\0';
    pcVar50[0xd1] = '\0';
    pcVar50[0xd2] = -0x80;
    pcVar50[0xd3] = '\x7f';
    pcVar50[0xd4] = '\0';
    pcVar50[0xd5] = '\0';
    pcVar50[0xd6] = -0x80;
    pcVar50[0xd7] = '\x7f';
    pcVar50[0xd8] = '\0';
    pcVar50[0xd9] = '\0';
    pcVar50[0xda] = -0x80;
    pcVar50[0xdb] = '\x7f';
    pcVar50[0xdc] = '\0';
    pcVar50[0xdd] = '\0';
    pcVar50[0xde] = -0x80;
    pcVar50[0xdf] = '\x7f';
    pcVar50[0x80] = '\0';
    pcVar50[0x81] = '\0';
    pcVar50[0x82] = -0x80;
    pcVar50[0x83] = '\x7f';
    pcVar50[0x84] = '\0';
    pcVar50[0x85] = '\0';
    pcVar50[0x86] = -0x80;
    pcVar50[0x87] = '\x7f';
    pcVar50[0x88] = '\0';
    pcVar50[0x89] = '\0';
    pcVar50[0x8a] = -0x80;
    pcVar50[0x8b] = '\x7f';
    pcVar50[0x8c] = '\0';
    pcVar50[0x8d] = '\0';
    pcVar50[0x8e] = -0x80;
    pcVar50[0x8f] = '\x7f';
    pcVar50[0x90] = '\0';
    pcVar50[0x91] = '\0';
    pcVar50[0x92] = -0x80;
    pcVar50[0x93] = '\x7f';
    pcVar50[0x94] = '\0';
    pcVar50[0x95] = '\0';
    pcVar50[0x96] = -0x80;
    pcVar50[0x97] = '\x7f';
    pcVar50[0x98] = '\0';
    pcVar50[0x99] = '\0';
    pcVar50[0x9a] = -0x80;
    pcVar50[0x9b] = '\x7f';
    pcVar50[0x9c] = '\0';
    pcVar50[0x9d] = '\0';
    pcVar50[0x9e] = -0x80;
    pcVar50[0x9f] = '\x7f';
    pcVar50[0x40] = '\0';
    pcVar50[0x41] = '\0';
    pcVar50[0x42] = -0x80;
    pcVar50[0x43] = '\x7f';
    pcVar50[0x44] = '\0';
    pcVar50[0x45] = '\0';
    pcVar50[0x46] = -0x80;
    pcVar50[0x47] = '\x7f';
    pcVar50[0x48] = '\0';
    pcVar50[0x49] = '\0';
    pcVar50[0x4a] = -0x80;
    pcVar50[0x4b] = '\x7f';
    pcVar50[0x4c] = '\0';
    pcVar50[0x4d] = '\0';
    pcVar50[0x4e] = -0x80;
    pcVar50[0x4f] = '\x7f';
    pcVar50[0x50] = '\0';
    pcVar50[0x51] = '\0';
    pcVar50[0x52] = -0x80;
    pcVar50[0x53] = '\x7f';
    pcVar50[0x54] = '\0';
    pcVar50[0x55] = '\0';
    pcVar50[0x56] = -0x80;
    pcVar50[0x57] = '\x7f';
    pcVar50[0x58] = '\0';
    pcVar50[0x59] = '\0';
    pcVar50[0x5a] = -0x80;
    pcVar50[0x5b] = '\x7f';
    pcVar50[0x5c] = '\0';
    pcVar50[0x5d] = '\0';
    pcVar50[0x5e] = -0x80;
    pcVar50[0x5f] = '\x7f';
    pcVar50[0xe0] = '\0';
    pcVar50[0xe1] = '\0';
    pcVar50[0xe2] = -0x80;
    pcVar50[0xe3] = -1;
    pcVar50[0xe4] = '\0';
    pcVar50[0xe5] = '\0';
    pcVar50[0xe6] = -0x80;
    pcVar50[0xe7] = -1;
    pcVar50[0xe8] = '\0';
    pcVar50[0xe9] = '\0';
    pcVar50[0xea] = -0x80;
    pcVar50[0xeb] = -1;
    pcVar50[0xec] = '\0';
    pcVar50[0xed] = '\0';
    pcVar50[0xee] = -0x80;
    pcVar50[0xef] = -1;
    pcVar50[0xf0] = '\0';
    pcVar50[0xf1] = '\0';
    pcVar50[0xf2] = -0x80;
    pcVar50[0xf3] = -1;
    pcVar50[0xf4] = '\0';
    pcVar50[0xf5] = '\0';
    pcVar50[0xf6] = -0x80;
    pcVar50[0xf7] = -1;
    pcVar50[0xf8] = '\0';
    pcVar50[0xf9] = '\0';
    pcVar50[0xfa] = -0x80;
    pcVar50[0xfb] = -1;
    pcVar50[0xfc] = '\0';
    pcVar50[0xfd] = '\0';
    pcVar50[0xfe] = -0x80;
    pcVar50[0xff] = -1;
    pcVar50[0xa0] = '\0';
    pcVar50[0xa1] = '\0';
    pcVar50[0xa2] = -0x80;
    pcVar50[0xa3] = -1;
    pcVar50[0xa4] = '\0';
    pcVar50[0xa5] = '\0';
    pcVar50[0xa6] = -0x80;
    pcVar50[0xa7] = -1;
    pcVar50[0xa8] = '\0';
    pcVar50[0xa9] = '\0';
    pcVar50[0xaa] = -0x80;
    pcVar50[0xab] = -1;
    pcVar50[0xac] = '\0';
    pcVar50[0xad] = '\0';
    pcVar50[0xae] = -0x80;
    pcVar50[0xaf] = -1;
    pcVar50[0xb0] = '\0';
    pcVar50[0xb1] = '\0';
    pcVar50[0xb2] = -0x80;
    pcVar50[0xb3] = -1;
    pcVar50[0xb4] = '\0';
    pcVar50[0xb5] = '\0';
    pcVar50[0xb6] = -0x80;
    pcVar50[0xb7] = -1;
    pcVar50[0xb8] = '\0';
    pcVar50[0xb9] = '\0';
    pcVar50[0xba] = -0x80;
    pcVar50[0xbb] = -1;
    pcVar50[0xbc] = '\0';
    pcVar50[0xbd] = '\0';
    pcVar50[0xbe] = -0x80;
    pcVar50[0xbf] = -1;
    pcVar50[0x60] = '\0';
    pcVar50[0x61] = '\0';
    pcVar50[0x62] = -0x80;
    pcVar50[99] = -1;
    pcVar50[100] = '\0';
    pcVar50[0x65] = '\0';
    pcVar50[0x66] = -0x80;
    pcVar50[0x67] = -1;
    pcVar50[0x68] = '\0';
    pcVar50[0x69] = '\0';
    pcVar50[0x6a] = -0x80;
    pcVar50[0x6b] = -1;
    pcVar50[0x6c] = '\0';
    pcVar50[0x6d] = '\0';
    pcVar50[0x6e] = -0x80;
    pcVar50[0x6f] = -1;
    pcVar50[0x70] = '\0';
    pcVar50[0x71] = '\0';
    pcVar50[0x72] = -0x80;
    pcVar50[0x73] = -1;
    pcVar50[0x74] = '\0';
    pcVar50[0x75] = '\0';
    pcVar50[0x76] = -0x80;
    pcVar50[0x77] = -1;
    pcVar50[0x78] = '\0';
    pcVar50[0x79] = '\0';
    pcVar50[0x7a] = -0x80;
    pcVar50[0x7b] = -1;
    pcVar50[0x7c] = '\0';
    pcVar50[0x7d] = '\0';
    pcVar50[0x7e] = -0x80;
    pcVar50[0x7f] = -1;
    auVar72 = ZEXT1232(ZEXT812(0)) << 0x20;
    *(undefined1 (*) [32])(pcVar50 + 0x100) = auVar72;
    *(undefined1 (*) [32])(pcVar50 + 0x120) = auVar72;
    auVar72 = ZEXT1232(ZEXT812(0)) << 0x20;
    *(undefined1 (*) [32])(pcVar50 + 0x140) = auVar72;
    *(undefined1 (*) [32])(pcVar50 + 0x160) = auVar72;
    *(undefined1 (*) [32])(pcVar50 + 0x180) = auVar72;
    *(undefined1 (*) [32])(pcVar50 + 0x1a0) = auVar72;
    pcVar50[0] = '\b';
    pcVar50[1] = '\0';
    pcVar50[2] = '\0';
    pcVar50[3] = '\0';
    pcVar50[4] = '\0';
    pcVar50[5] = '\0';
    pcVar50[6] = '\0';
    pcVar50[7] = '\0';
    pcVar50[8] = '\b';
    pcVar50[9] = '\0';
    pcVar50[10] = '\0';
    pcVar50[0xb] = '\0';
    pcVar50[0xc] = '\0';
    pcVar50[0xd] = '\0';
    pcVar50[0xe] = '\0';
    pcVar50[0xf] = '\0';
    pcVar50[0x10] = '\b';
    pcVar50[0x11] = '\0';
    pcVar50[0x12] = '\0';
    pcVar50[0x13] = '\0';
    pcVar50[0x14] = '\0';
    pcVar50[0x15] = '\0';
    pcVar50[0x16] = '\0';
    pcVar50[0x17] = '\0';
    pcVar50[0x18] = '\b';
    pcVar50[0x19] = '\0';
    pcVar50[0x1a] = '\0';
    pcVar50[0x1b] = '\0';
    pcVar50[0x1c] = '\0';
    pcVar50[0x1d] = '\0';
    pcVar50[0x1e] = '\0';
    pcVar50[0x1f] = '\0';
    pcVar50[0x20] = '\b';
    pcVar50[0x21] = '\0';
    pcVar50[0x22] = '\0';
    pcVar50[0x23] = '\0';
    pcVar50[0x24] = '\0';
    pcVar50[0x25] = '\0';
    pcVar50[0x26] = '\0';
    pcVar50[0x27] = '\0';
    pcVar50[0x28] = '\b';
    pcVar50[0x29] = '\0';
    pcVar50[0x2a] = '\0';
    pcVar50[0x2b] = '\0';
    pcVar50[0x2c] = '\0';
    pcVar50[0x2d] = '\0';
    pcVar50[0x2e] = '\0';
    pcVar50[0x2f] = '\0';
    pcVar50[0x30] = '\b';
    pcVar50[0x31] = '\0';
    pcVar50[0x32] = '\0';
    pcVar50[0x33] = '\0';
    pcVar50[0x34] = '\0';
    pcVar50[0x35] = '\0';
    pcVar50[0x36] = '\0';
    pcVar50[0x37] = '\0';
    pcVar50[0x38] = '\b';
    pcVar50[0x39] = '\0';
    pcVar50[0x3a] = '\0';
    pcVar50[0x3b] = '\0';
    pcVar50[0x3c] = '\0';
    pcVar50[0x3d] = '\0';
    pcVar50[0x3e] = '\0';
    pcVar50[0x3f] = '\0';
    uVar60 = 1;
    uVar51 = 0;
    goto LAB_013381ec;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x200;
  pTVar8 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar8->alloc)._M_b._M_p) {
    v1.field_0.v[1]._0_1_ = 1;
    v1.field_0.v[0] = (longlong)pTVar8;
    MutexSys::lock(&pTVar8->mutex);
    if ((pTVar8->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar8->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar8->alloc1).bytesUsed + (pTVar8->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar8->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar8->alloc0).end + (pTVar8->alloc1).end) -
           ((pTVar8->alloc0).cur + (pTVar8->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar8->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar8->alloc1).bytesWasted + (pTVar8->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar72 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar8->alloc0).end = auVar72._0_8_;
    (pTVar8->alloc0).allocBlockSize = auVar72._8_8_;
    (pTVar8->alloc0).bytesUsed = auVar72._16_8_;
    (pTVar8->alloc0).bytesWasted = auVar72._24_8_;
    (pTVar8->alloc0).ptr = (char *)auVar72._0_8_;
    (pTVar8->alloc0).cur = auVar72._8_8_;
    (pTVar8->alloc0).end = auVar72._16_8_;
    (pTVar8->alloc0).allocBlockSize = auVar72._24_8_;
    auVar72 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar8->alloc1).end = auVar72._0_8_;
      (pTVar8->alloc1).allocBlockSize = auVar72._8_8_;
      (pTVar8->alloc1).bytesUsed = auVar72._16_8_;
      (pTVar8->alloc1).bytesWasted = auVar72._24_8_;
      (pTVar8->alloc1).ptr = (char *)auVar72._0_8_;
      (pTVar8->alloc1).cur = auVar72._8_8_;
      (pTVar8->alloc1).end = auVar72._16_8_;
      (pTVar8->alloc1).allocBlockSize = auVar72._24_8_;
    }
    else {
      (pTVar8->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar8->alloc1).ptr = (char *)auVar72._0_8_;
      (pTVar8->alloc1).cur = auVar72._8_8_;
      (pTVar8->alloc1).end = auVar72._16_8_;
      (pTVar8->alloc1).allocBlockSize = auVar72._24_8_;
      (pTVar8->alloc1).end = auVar72._0_8_;
      (pTVar8->alloc1).allocBlockSize = auVar72._8_8_;
      (pTVar8->alloc1).bytesUsed = auVar72._16_8_;
      (pTVar8->alloc1).bytesWasted = auVar72._24_8_;
      (pTVar8->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar8->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    v2.field_0.v[0] = (longlong)pTVar8;
    v0.field_0.v[1]._0_1_ = 1;
    v0.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar9._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar9._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar9,(ThreadLocal2 **)&v2);
    }
    else {
      *iVar9._M_current = (ThreadLocal2 *)v2.field_0.v[0];
      pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    uVar53 = &FastAllocator::s_thread_local_allocators_lock;
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (v1.field_0.v[1]._0_1_ == '\x01') {
      uVar53 = v1.field_0.v[0];
      MutexSys::unlock((MutexSys *)v1.field_0.v[0]);
    }
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar38 = (alloc.talloc0)->cur;
  uVar51 = (ulong)(-(int)sVar38 & 0x1f);
  uVar60 = sVar38 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar51;
  (alloc.talloc0)->cur = uVar60;
  if ((alloc.talloc0)->end < uVar60) {
    (alloc.talloc0)->cur = sVar38;
    uVar53 = alloc.alloc;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar50 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
      pcVar50 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
      (alloc.talloc0)->ptr = pcVar50;
      sVar38 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar38;
      (alloc.talloc0)->end = v0.field_0.v[0];
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      this = pBVar136;
      if ((ulong)v0.field_0.v[0] <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        uVar53 = alloc.alloc;
        pcVar50 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
        (alloc.talloc0)->ptr = pcVar50;
        sVar38 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar38;
        (alloc.talloc0)->end = v0.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)v0.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar50 = (char *)0x0;
          pBVar136 = this;
          goto LAB_01338054;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar38;
      pBVar136 = this;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar51;
    pcVar50 = (alloc.talloc0)->ptr +
              (uVar60 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_01338054:
  pcVar50[0x1c0] = '\0';
  pcVar50[0x1c1] = '\0';
  pcVar50[0x1c2] = -0x80;
  pcVar50[0x1c3] = '\x7f';
  pcVar50[0x1c4] = '\0';
  pcVar50[0x1c5] = '\0';
  pcVar50[0x1c6] = -0x80;
  pcVar50[0x1c7] = '\x7f';
  pcVar50[0x1c8] = '\0';
  pcVar50[0x1c9] = '\0';
  pcVar50[0x1ca] = -0x80;
  pcVar50[0x1cb] = '\x7f';
  pcVar50[0x1cc] = '\0';
  pcVar50[0x1cd] = '\0';
  pcVar50[0x1ce] = -0x80;
  pcVar50[0x1cf] = '\x7f';
  pcVar50[0x1d0] = '\0';
  pcVar50[0x1d1] = '\0';
  pcVar50[0x1d2] = -0x80;
  pcVar50[0x1d3] = '\x7f';
  pcVar50[0x1d4] = '\0';
  pcVar50[0x1d5] = '\0';
  pcVar50[0x1d6] = -0x80;
  pcVar50[0x1d7] = '\x7f';
  pcVar50[0x1d8] = '\0';
  pcVar50[0x1d9] = '\0';
  pcVar50[0x1da] = -0x80;
  pcVar50[0x1db] = '\x7f';
  pcVar50[0x1dc] = '\0';
  pcVar50[0x1dd] = '\0';
  pcVar50[0x1de] = -0x80;
  pcVar50[0x1df] = '\x7f';
  pcVar50[0x1e0] = '\0';
  pcVar50[0x1e1] = '\0';
  pcVar50[0x1e2] = -0x80;
  pcVar50[0x1e3] = -1;
  pcVar50[0x1e4] = '\0';
  pcVar50[0x1e5] = '\0';
  pcVar50[0x1e6] = -0x80;
  pcVar50[0x1e7] = -1;
  pcVar50[0x1e8] = '\0';
  pcVar50[0x1e9] = '\0';
  pcVar50[0x1ea] = -0x80;
  pcVar50[0x1eb] = -1;
  pcVar50[0x1ec] = '\0';
  pcVar50[0x1ed] = '\0';
  pcVar50[0x1ee] = -0x80;
  pcVar50[0x1ef] = -1;
  pcVar50[0x1f0] = '\0';
  pcVar50[0x1f1] = '\0';
  pcVar50[0x1f2] = -0x80;
  pcVar50[499] = -1;
  pcVar50[500] = '\0';
  pcVar50[0x1f5] = '\0';
  pcVar50[0x1f6] = -0x80;
  pcVar50[0x1f7] = -1;
  pcVar50[0x1f8] = '\0';
  pcVar50[0x1f9] = '\0';
  pcVar50[0x1fa] = -0x80;
  pcVar50[0x1fb] = -1;
  pcVar50[0x1fc] = '\0';
  pcVar50[0x1fd] = '\0';
  pcVar50[0x1fe] = -0x80;
  pcVar50[0x1ff] = -1;
  pcVar50[0xc0] = '\0';
  pcVar50[0xc1] = '\0';
  pcVar50[0xc2] = -0x80;
  pcVar50[0xc3] = '\x7f';
  pcVar50[0xc4] = '\0';
  pcVar50[0xc5] = '\0';
  pcVar50[0xc6] = -0x80;
  pcVar50[199] = '\x7f';
  pcVar50[200] = '\0';
  pcVar50[0xc9] = '\0';
  pcVar50[0xca] = -0x80;
  pcVar50[0xcb] = '\x7f';
  pcVar50[0xcc] = '\0';
  pcVar50[0xcd] = '\0';
  pcVar50[0xce] = -0x80;
  pcVar50[0xcf] = '\x7f';
  pcVar50[0xd0] = '\0';
  pcVar50[0xd1] = '\0';
  pcVar50[0xd2] = -0x80;
  pcVar50[0xd3] = '\x7f';
  pcVar50[0xd4] = '\0';
  pcVar50[0xd5] = '\0';
  pcVar50[0xd6] = -0x80;
  pcVar50[0xd7] = '\x7f';
  pcVar50[0xd8] = '\0';
  pcVar50[0xd9] = '\0';
  pcVar50[0xda] = -0x80;
  pcVar50[0xdb] = '\x7f';
  pcVar50[0xdc] = '\0';
  pcVar50[0xdd] = '\0';
  pcVar50[0xde] = -0x80;
  pcVar50[0xdf] = '\x7f';
  pcVar50[0x80] = '\0';
  pcVar50[0x81] = '\0';
  pcVar50[0x82] = -0x80;
  pcVar50[0x83] = '\x7f';
  pcVar50[0x84] = '\0';
  pcVar50[0x85] = '\0';
  pcVar50[0x86] = -0x80;
  pcVar50[0x87] = '\x7f';
  pcVar50[0x88] = '\0';
  pcVar50[0x89] = '\0';
  pcVar50[0x8a] = -0x80;
  pcVar50[0x8b] = '\x7f';
  pcVar50[0x8c] = '\0';
  pcVar50[0x8d] = '\0';
  pcVar50[0x8e] = -0x80;
  pcVar50[0x8f] = '\x7f';
  pcVar50[0x90] = '\0';
  pcVar50[0x91] = '\0';
  pcVar50[0x92] = -0x80;
  pcVar50[0x93] = '\x7f';
  pcVar50[0x94] = '\0';
  pcVar50[0x95] = '\0';
  pcVar50[0x96] = -0x80;
  pcVar50[0x97] = '\x7f';
  pcVar50[0x98] = '\0';
  pcVar50[0x99] = '\0';
  pcVar50[0x9a] = -0x80;
  pcVar50[0x9b] = '\x7f';
  pcVar50[0x9c] = '\0';
  pcVar50[0x9d] = '\0';
  pcVar50[0x9e] = -0x80;
  pcVar50[0x9f] = '\x7f';
  pcVar50[0x40] = '\0';
  pcVar50[0x41] = '\0';
  pcVar50[0x42] = -0x80;
  pcVar50[0x43] = '\x7f';
  pcVar50[0x44] = '\0';
  pcVar50[0x45] = '\0';
  pcVar50[0x46] = -0x80;
  pcVar50[0x47] = '\x7f';
  pcVar50[0x48] = '\0';
  pcVar50[0x49] = '\0';
  pcVar50[0x4a] = -0x80;
  pcVar50[0x4b] = '\x7f';
  pcVar50[0x4c] = '\0';
  pcVar50[0x4d] = '\0';
  pcVar50[0x4e] = -0x80;
  pcVar50[0x4f] = '\x7f';
  pcVar50[0x50] = '\0';
  pcVar50[0x51] = '\0';
  pcVar50[0x52] = -0x80;
  pcVar50[0x53] = '\x7f';
  pcVar50[0x54] = '\0';
  pcVar50[0x55] = '\0';
  pcVar50[0x56] = -0x80;
  pcVar50[0x57] = '\x7f';
  pcVar50[0x58] = '\0';
  pcVar50[0x59] = '\0';
  pcVar50[0x5a] = -0x80;
  pcVar50[0x5b] = '\x7f';
  pcVar50[0x5c] = '\0';
  pcVar50[0x5d] = '\0';
  pcVar50[0x5e] = -0x80;
  pcVar50[0x5f] = '\x7f';
  pcVar50[0xe0] = '\0';
  pcVar50[0xe1] = '\0';
  pcVar50[0xe2] = -0x80;
  pcVar50[0xe3] = -1;
  pcVar50[0xe4] = '\0';
  pcVar50[0xe5] = '\0';
  pcVar50[0xe6] = -0x80;
  pcVar50[0xe7] = -1;
  pcVar50[0xe8] = '\0';
  pcVar50[0xe9] = '\0';
  pcVar50[0xea] = -0x80;
  pcVar50[0xeb] = -1;
  pcVar50[0xec] = '\0';
  pcVar50[0xed] = '\0';
  pcVar50[0xee] = -0x80;
  pcVar50[0xef] = -1;
  pcVar50[0xf0] = '\0';
  pcVar50[0xf1] = '\0';
  pcVar50[0xf2] = -0x80;
  pcVar50[0xf3] = -1;
  pcVar50[0xf4] = '\0';
  pcVar50[0xf5] = '\0';
  pcVar50[0xf6] = -0x80;
  pcVar50[0xf7] = -1;
  pcVar50[0xf8] = '\0';
  pcVar50[0xf9] = '\0';
  pcVar50[0xfa] = -0x80;
  pcVar50[0xfb] = -1;
  pcVar50[0xfc] = '\0';
  pcVar50[0xfd] = '\0';
  pcVar50[0xfe] = -0x80;
  pcVar50[0xff] = -1;
  pcVar50[0xa0] = '\0';
  pcVar50[0xa1] = '\0';
  pcVar50[0xa2] = -0x80;
  pcVar50[0xa3] = -1;
  pcVar50[0xa4] = '\0';
  pcVar50[0xa5] = '\0';
  pcVar50[0xa6] = -0x80;
  pcVar50[0xa7] = -1;
  pcVar50[0xa8] = '\0';
  pcVar50[0xa9] = '\0';
  pcVar50[0xaa] = -0x80;
  pcVar50[0xab] = -1;
  pcVar50[0xac] = '\0';
  pcVar50[0xad] = '\0';
  pcVar50[0xae] = -0x80;
  pcVar50[0xaf] = -1;
  pcVar50[0xb0] = '\0';
  pcVar50[0xb1] = '\0';
  pcVar50[0xb2] = -0x80;
  pcVar50[0xb3] = -1;
  pcVar50[0xb4] = '\0';
  pcVar50[0xb5] = '\0';
  pcVar50[0xb6] = -0x80;
  pcVar50[0xb7] = -1;
  pcVar50[0xb8] = '\0';
  pcVar50[0xb9] = '\0';
  pcVar50[0xba] = -0x80;
  pcVar50[0xbb] = -1;
  pcVar50[0xbc] = '\0';
  pcVar50[0xbd] = '\0';
  pcVar50[0xbe] = -0x80;
  pcVar50[0xbf] = -1;
  pcVar50[0x60] = '\0';
  pcVar50[0x61] = '\0';
  pcVar50[0x62] = -0x80;
  pcVar50[99] = -1;
  pcVar50[100] = '\0';
  pcVar50[0x65] = '\0';
  pcVar50[0x66] = -0x80;
  pcVar50[0x67] = -1;
  pcVar50[0x68] = '\0';
  pcVar50[0x69] = '\0';
  pcVar50[0x6a] = -0x80;
  pcVar50[0x6b] = -1;
  pcVar50[0x6c] = '\0';
  pcVar50[0x6d] = '\0';
  pcVar50[0x6e] = -0x80;
  pcVar50[0x6f] = -1;
  pcVar50[0x70] = '\0';
  pcVar50[0x71] = '\0';
  pcVar50[0x72] = -0x80;
  pcVar50[0x73] = -1;
  pcVar50[0x74] = '\0';
  pcVar50[0x75] = '\0';
  pcVar50[0x76] = -0x80;
  pcVar50[0x77] = -1;
  pcVar50[0x78] = '\0';
  pcVar50[0x79] = '\0';
  pcVar50[0x7a] = -0x80;
  pcVar50[0x7b] = -1;
  pcVar50[0x7c] = '\0';
  pcVar50[0x7d] = '\0';
  pcVar50[0x7e] = -0x80;
  pcVar50[0x7f] = -1;
  auVar72 = ZEXT1232(ZEXT812(0)) << 0x20;
  *(undefined1 (*) [32])(pcVar50 + 0x100) = auVar72;
  *(undefined1 (*) [32])(pcVar50 + 0x120) = auVar72;
  auVar72 = ZEXT1232(ZEXT812(0)) << 0x20;
  *(undefined1 (*) [32])(pcVar50 + 0x140) = auVar72;
  *(undefined1 (*) [32])(pcVar50 + 0x160) = auVar72;
  *(undefined1 (*) [32])(pcVar50 + 0x180) = auVar72;
  *(undefined1 (*) [32])(pcVar50 + 0x1a0) = auVar72;
  pcVar50[0] = '\b';
  pcVar50[1] = '\0';
  pcVar50[2] = '\0';
  pcVar50[3] = '\0';
  pcVar50[4] = '\0';
  pcVar50[5] = '\0';
  pcVar50[6] = '\0';
  pcVar50[7] = '\0';
  pcVar50[8] = '\b';
  pcVar50[9] = '\0';
  pcVar50[10] = '\0';
  pcVar50[0xb] = '\0';
  pcVar50[0xc] = '\0';
  pcVar50[0xd] = '\0';
  pcVar50[0xe] = '\0';
  pcVar50[0xf] = '\0';
  pcVar50[0x10] = '\b';
  pcVar50[0x11] = '\0';
  pcVar50[0x12] = '\0';
  pcVar50[0x13] = '\0';
  pcVar50[0x14] = '\0';
  pcVar50[0x15] = '\0';
  pcVar50[0x16] = '\0';
  pcVar50[0x17] = '\0';
  pcVar50[0x18] = '\b';
  pcVar50[0x19] = '\0';
  pcVar50[0x1a] = '\0';
  pcVar50[0x1b] = '\0';
  pcVar50[0x1c] = '\0';
  pcVar50[0x1d] = '\0';
  pcVar50[0x1e] = '\0';
  pcVar50[0x1f] = '\0';
  pcVar50[0x20] = '\b';
  pcVar50[0x21] = '\0';
  pcVar50[0x22] = '\0';
  pcVar50[0x23] = '\0';
  pcVar50[0x24] = '\0';
  pcVar50[0x25] = '\0';
  pcVar50[0x26] = '\0';
  pcVar50[0x27] = '\0';
  pcVar50[0x28] = '\b';
  pcVar50[0x29] = '\0';
  pcVar50[0x2a] = '\0';
  pcVar50[0x2b] = '\0';
  pcVar50[0x2c] = '\0';
  pcVar50[0x2d] = '\0';
  pcVar50[0x2e] = '\0';
  pcVar50[0x2f] = '\0';
  pcVar50[0x30] = '\b';
  pcVar50[0x31] = '\0';
  pcVar50[0x32] = '\0';
  pcVar50[0x33] = '\0';
  pcVar50[0x34] = '\0';
  pcVar50[0x35] = '\0';
  pcVar50[0x36] = '\0';
  pcVar50[0x37] = '\0';
  pcVar50[0x38] = '\b';
  pcVar50[0x39] = '\0';
  pcVar50[0x3a] = '\0';
  pcVar50[0x3b] = '\0';
  pcVar50[0x3c] = '\0';
  pcVar50[0x3d] = '\0';
  pcVar50[0x3e] = '\0';
  pcVar50[0x3f] = '\0';
  uVar51 = CONCAT71(SUB87(uVar53,1),1);
  uVar60 = 6;
LAB_013381ec:
  local_1e58.i[2] = 0xff800000;
  local_1e58._0_8_ = 0xff800000ff800000;
  local_1e58.i[3] = 0xff800000;
  fVar74 = INFINITY;
  fVar85 = INFINITY;
  fVar106 = INFINITY;
  fVar115 = INFINITY;
  if (local_848 != 0) {
    local_1e08.m128[0] = (float)(int)uVar51;
    pBVar41 = &values[0].dt;
    uVar51 = 0;
    local_1dc8._8_4_ = 0x7f800000;
    local_1dc8._0_8_ = 0x7f8000007f800000;
    local_1dc8._12_4_ = 0x7f800000;
    fStack_1e30 = INFINITY;
    local_1e38 = (undefined1  [8])0x7f8000007f800000;
    fStack_1e2c = INFINITY;
    local_1df8.m128[2] = -INFINITY;
    local_1df8._0_8_ = 0xff800000ff800000;
    local_1df8.m128[3] = -INFINITY;
    local_1e58.i[2] = 0xff800000;
    local_1e58._0_8_ = 0xff800000ff800000;
    local_1e58.i[3] = 0xff800000;
    in_00 = (BuildRecord *)&geomID;
    this = pBVar136;
    do {
      createLargeLeaf((NodeRecordMB4D *)&v0,this,in_00,alloc);
      vVar24 = v0;
      pBVar41[-10].lower = (float)v0.field_0.v[0]._0_4_;
      pBVar41[-10].upper = (float)v0.field_0._4_4_;
      auVar18._8_8_ = local_1c08._8_8_;
      auVar18._0_8_ = local_1c08._0_8_;
      *(undefined1 (*) [16])(pBVar41 + -8) = auVar18;
      auVar19._8_8_ = aStack_1bf8._8_8_;
      auVar19._0_8_ = aStack_1bf8._0_8_;
      *(undefined1 (*) [16])(pBVar41 + -6) = auVar19;
      auVar20._8_8_ = local_1be8._8_8_;
      auVar20._0_8_ = local_1be8._0_8_;
      *(undefined1 (*) [16])(pBVar41 + -4) = auVar20;
      auVar21._8_8_ = aStack_1bd8._8_8_;
      auVar21._0_8_ = aStack_1bd8._0_8_;
      *(undefined1 (*) [16])(pBVar41 + -2) = auVar21;
      pBVar41->lower = (float)local_1bc8._0_4_;
      pBVar41->upper = local_1bc8.m128[1];
      local_1dc8 = vminps_avx(local_1dc8,auVar18);
      local_1df8.m128 = (__m128)vmaxps_avx(local_1df8.m128,auVar19);
      _local_1e38 = (__m128)vminps_avx(_local_1e38,auVar20);
      local_1e58.v = (__m128)vmaxps_avx(local_1e58.v,auVar21);
      uVar51 = uVar51 + 1;
      pBVar41 = pBVar41 + 0xc;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
      v0 = vVar24;
    } while (uVar51 < local_848);
    if (((uint)uVar60 | (uint)pcVar50 & 0xf) == 1) {
      if (local_848 != 0) {
        uVar51 = (ulong)pcVar50 & 0xfffffffffffffff0;
        pfVar47 = &values[0].dt.upper;
        lVar42 = 0;
        auVar88._8_4_ = 0x7f7fffff;
        auVar88._0_8_ = 0x7f7fffff7f7fffff;
        auVar88._12_4_ = 0x7f7fffff;
        auVar92._8_4_ = 0xff7fffff;
        auVar92._0_8_ = 0xff7fffffff7fffff;
        auVar92._12_4_ = 0xff7fffff;
        auVar99._8_4_ = 0x7fffffff;
        auVar99._0_8_ = 0x7fffffff7fffffff;
        auVar99._12_4_ = 0x7fffffff;
        do {
          *(undefined8 *)(uVar51 + lVar42 * 8) = *(undefined8 *)(pfVar47 + -0x15);
          fVar74 = ((BBox1f *)(pfVar47 + -1))->lower;
          fVar106 = 1.0 / (*pfVar47 - fVar74);
          fVar85 = -fVar74 * fVar106;
          auVar66 = vshufps_avx(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85),0);
          auVar68 = vshufps_avx(ZEXT416((uint)(1.0 - fVar85)),ZEXT416((uint)(1.0 - fVar85)),0);
          auVar133._0_4_ = pfVar47[-9] * auVar66._0_4_ + pfVar47[-0x11] * auVar68._0_4_;
          auVar133._4_4_ = pfVar47[-8] * auVar66._4_4_ + pfVar47[-0x10] * auVar68._4_4_;
          auVar133._8_4_ = pfVar47[-7] * auVar66._8_4_ + pfVar47[-0xf] * auVar68._8_4_;
          auVar133._12_4_ = pfVar47[-6] * auVar66._12_4_ + pfVar47[-0xe] * auVar68._12_4_;
          auVar113._0_4_ = pfVar47[-5] * auVar66._0_4_ + pfVar47[-0xd] * auVar68._0_4_;
          auVar113._4_4_ = pfVar47[-4] * auVar66._4_4_ + pfVar47[-0xc] * auVar68._4_4_;
          auVar113._8_4_ = pfVar47[-3] * auVar66._8_4_ + pfVar47[-0xb] * auVar68._8_4_;
          auVar113._12_4_ = pfVar47[-2] * auVar66._12_4_ + pfVar47[-10] * auVar68._12_4_;
          fVar106 = (1.0 - fVar74) * fVar106;
          auVar66 = vshufps_avx(ZEXT416((uint)fVar106),ZEXT416((uint)fVar106),0);
          auVar68 = vshufps_avx(ZEXT416((uint)(1.0 - fVar106)),ZEXT416((uint)(1.0 - fVar106)),0);
          auVar116._0_4_ = pfVar47[-9] * auVar66._0_4_ + pfVar47[-0x11] * auVar68._0_4_;
          auVar116._4_4_ = pfVar47[-8] * auVar66._4_4_ + pfVar47[-0x10] * auVar68._4_4_;
          auVar116._8_4_ = pfVar47[-7] * auVar66._8_4_ + pfVar47[-0xf] * auVar68._8_4_;
          auVar116._12_4_ = pfVar47[-6] * auVar66._12_4_ + pfVar47[-0xe] * auVar68._12_4_;
          auVar107._0_4_ = pfVar47[-5] * auVar66._0_4_ + pfVar47[-0xd] * auVar68._0_4_;
          auVar107._4_4_ = pfVar47[-4] * auVar66._4_4_ + pfVar47[-0xc] * auVar68._4_4_;
          auVar107._8_4_ = pfVar47[-3] * auVar66._8_4_ + pfVar47[-0xb] * auVar68._8_4_;
          auVar107._12_4_ = pfVar47[-2] * auVar66._12_4_ + pfVar47[-10] * auVar68._12_4_;
          auVar82 = vminps_avx(auVar133,auVar88);
          auVar68 = vmaxps_avx(auVar113,auVar92);
          auVar77 = vminps_avx(auVar116,auVar88);
          auVar67 = vmaxps_avx(auVar107,auVar92);
          auVar66 = vandps_avx(auVar82,auVar99);
          auVar122._0_4_ = auVar66._0_4_ * 4.7683716e-07;
          auVar122._4_4_ = auVar66._4_4_ * 4.7683716e-07;
          auVar122._8_4_ = auVar66._8_4_ * 4.7683716e-07;
          auVar122._12_4_ = auVar66._12_4_ * 4.7683716e-07;
          auVar82 = vsubps_avx(auVar82,auVar122);
          auVar66 = vandps_avx(auVar68,auVar99);
          auVar114._0_4_ = auVar68._0_4_ + auVar66._0_4_ * 4.7683716e-07;
          auVar114._4_4_ = auVar68._4_4_ + auVar66._4_4_ * 4.7683716e-07;
          auVar114._8_4_ = auVar68._8_4_ + auVar66._8_4_ * 4.7683716e-07;
          auVar114._12_4_ = auVar68._12_4_ + auVar66._12_4_ * 4.7683716e-07;
          auVar66 = vandps_avx(auVar77,auVar99);
          auVar123._0_4_ = auVar66._0_4_ * 4.7683716e-07;
          auVar123._4_4_ = auVar66._4_4_ * 4.7683716e-07;
          auVar123._8_4_ = auVar66._8_4_ * 4.7683716e-07;
          auVar123._12_4_ = auVar66._12_4_ * 4.7683716e-07;
          auVar68 = vsubps_avx(auVar77,auVar123);
          auVar66 = vandps_avx(auVar67,auVar99);
          *(int *)(uVar51 + 0x40 + lVar42 * 4) = auVar82._0_4_;
          uVar5 = vextractps_avx(auVar82,1);
          *(undefined4 *)(uVar51 + 0x80 + lVar42 * 4) = uVar5;
          auVar108._0_4_ = auVar66._0_4_ * 4.7683716e-07 + auVar67._0_4_;
          auVar108._4_4_ = auVar66._4_4_ * 4.7683716e-07 + auVar67._4_4_;
          auVar108._8_4_ = auVar66._8_4_ * 4.7683716e-07 + auVar67._8_4_;
          auVar108._12_4_ = auVar66._12_4_ * 4.7683716e-07 + auVar67._12_4_;
          uVar5 = vextractps_avx(auVar82,2);
          *(undefined4 *)(uVar51 + 0xc0 + lVar42 * 4) = uVar5;
          *(float *)(uVar51 + 0x60 + lVar42 * 4) = auVar114._0_4_;
          uVar5 = vextractps_avx(auVar114,1);
          *(undefined4 *)(uVar51 + 0xa0 + lVar42 * 4) = uVar5;
          auVar66 = vsubps_avx(auVar68,auVar82);
          uVar5 = vextractps_avx(auVar114,2);
          *(undefined4 *)(uVar51 + 0xe0 + lVar42 * 4) = uVar5;
          *(int *)(uVar51 + 0x100 + lVar42 * 4) = auVar66._0_4_;
          uVar5 = vextractps_avx(auVar66,1);
          *(undefined4 *)(uVar51 + 0x140 + lVar42 * 4) = uVar5;
          auVar68 = vsubps_avx(auVar108,auVar114);
          uVar5 = vextractps_avx(auVar66,2);
          *(undefined4 *)(uVar51 + 0x180 + lVar42 * 4) = uVar5;
          *(int *)(uVar51 + 0x120 + lVar42 * 4) = auVar68._0_4_;
          uVar5 = vextractps_avx(auVar68,1);
          *(undefined4 *)(uVar51 + 0x160 + lVar42 * 4) = uVar5;
          uVar5 = vextractps_avx(auVar68,2);
          *(undefined4 *)(uVar51 + 0x1a0 + lVar42 * 4) = uVar5;
          lVar42 = lVar42 + 1;
          pfVar47 = pfVar47 + 0x18;
        } while (local_848 != lVar42);
      }
    }
    else if (local_848 != 0) {
      uVar51 = (ulong)pcVar50 & 0xfffffffffffffff0;
      pfVar47 = &values[0].dt.upper;
      lVar42 = 0;
      auVar89._8_4_ = 0x7f7fffff;
      auVar89._0_8_ = 0x7f7fffff7f7fffff;
      auVar89._12_4_ = 0x7f7fffff;
      auVar94._8_4_ = 0xff7fffff;
      auVar94._0_8_ = 0xff7fffffff7fffff;
      auVar94._12_4_ = 0xff7fffff;
      auVar101._8_4_ = 0x7fffffff;
      auVar101._0_8_ = 0x7fffffff7fffffff;
      auVar101._12_4_ = 0x7fffffff;
      auVar109._8_4_ = 0x3f800001;
      auVar109._0_8_ = 0x3f8000013f800001;
      auVar109._12_4_ = 0x3f800001;
      do {
        *(undefined8 *)(uVar51 + lVar42 * 8) = *(undefined8 *)(pfVar47 + -0x15);
        fVar74 = *pfVar47;
        fVar85 = ((BBox1f *)(pfVar47 + -1))->lower;
        fVar115 = 1.0 / (fVar74 - fVar85);
        fVar106 = fVar115 * -fVar85;
        auVar66 = vshufps_avx(ZEXT416((uint)fVar106),ZEXT416((uint)fVar106),0);
        auVar68 = vshufps_avx(ZEXT416((uint)(1.0 - fVar106)),ZEXT416((uint)(1.0 - fVar106)),0);
        auVar84._0_4_ = pfVar47[-9] * auVar66._0_4_ + pfVar47[-0x11] * auVar68._0_4_;
        auVar84._4_4_ = pfVar47[-8] * auVar66._4_4_ + pfVar47[-0x10] * auVar68._4_4_;
        auVar84._8_4_ = pfVar47[-7] * auVar66._8_4_ + pfVar47[-0xf] * auVar68._8_4_;
        auVar84._12_4_ = pfVar47[-6] * auVar66._12_4_ + pfVar47[-0xe] * auVar68._12_4_;
        auVar124._0_4_ = pfVar47[-5] * auVar66._0_4_ + pfVar47[-0xd] * auVar68._0_4_;
        auVar124._4_4_ = pfVar47[-4] * auVar66._4_4_ + pfVar47[-0xc] * auVar68._4_4_;
        auVar124._8_4_ = pfVar47[-3] * auVar66._8_4_ + pfVar47[-0xb] * auVar68._8_4_;
        auVar124._12_4_ = pfVar47[-2] * auVar66._12_4_ + pfVar47[-10] * auVar68._12_4_;
        fVar115 = (1.0 - fVar85) * fVar115;
        auVar66 = vshufps_avx(ZEXT416((uint)fVar115),ZEXT416((uint)fVar115),0);
        auVar68 = vshufps_avx(ZEXT416((uint)(1.0 - fVar115)),ZEXT416((uint)(1.0 - fVar115)),0);
        auVar129._0_4_ = pfVar47[-9] * auVar66._0_4_ + pfVar47[-0x11] * auVar68._0_4_;
        auVar129._4_4_ = pfVar47[-8] * auVar66._4_4_ + pfVar47[-0x10] * auVar68._4_4_;
        auVar129._8_4_ = pfVar47[-7] * auVar66._8_4_ + pfVar47[-0xf] * auVar68._8_4_;
        auVar129._12_4_ = pfVar47[-6] * auVar66._12_4_ + pfVar47[-0xe] * auVar68._12_4_;
        auVar118._0_4_ = pfVar47[-5] * auVar66._0_4_ + pfVar47[-0xd] * auVar68._0_4_;
        auVar118._4_4_ = pfVar47[-4] * auVar66._4_4_ + pfVar47[-0xc] * auVar68._4_4_;
        auVar118._8_4_ = pfVar47[-3] * auVar66._8_4_ + pfVar47[-0xb] * auVar68._8_4_;
        auVar118._12_4_ = pfVar47[-2] * auVar66._12_4_ + pfVar47[-10] * auVar68._12_4_;
        auVar82 = vminps_avx(auVar84,auVar89);
        auVar68 = vmaxps_avx(auVar124,auVar94);
        auVar77 = vminps_avx(auVar129,auVar89);
        auVar67 = vmaxps_avx(auVar118,auVar94);
        auVar66 = vandps_avx(auVar82,auVar101);
        auVar130._0_4_ = auVar66._0_4_ * 4.7683716e-07;
        auVar130._4_4_ = auVar66._4_4_ * 4.7683716e-07;
        auVar130._8_4_ = auVar66._8_4_ * 4.7683716e-07;
        auVar130._12_4_ = auVar66._12_4_ * 4.7683716e-07;
        auVar82 = vsubps_avx(auVar82,auVar130);
        auVar66 = vandps_avx(auVar68,auVar101);
        auVar125._0_4_ = auVar68._0_4_ + auVar66._0_4_ * 4.7683716e-07;
        auVar125._4_4_ = auVar68._4_4_ + auVar66._4_4_ * 4.7683716e-07;
        auVar125._8_4_ = auVar68._8_4_ + auVar66._8_4_ * 4.7683716e-07;
        auVar125._12_4_ = auVar68._12_4_ + auVar66._12_4_ * 4.7683716e-07;
        auVar66 = vandps_avx(auVar77,auVar101);
        auVar131._0_4_ = auVar66._0_4_ * 4.7683716e-07;
        auVar131._4_4_ = auVar66._4_4_ * 4.7683716e-07;
        auVar131._8_4_ = auVar66._8_4_ * 4.7683716e-07;
        auVar131._12_4_ = auVar66._12_4_ * 4.7683716e-07;
        auVar68 = vsubps_avx(auVar77,auVar131);
        auVar66 = vandps_avx(auVar67,auVar101);
        *(int *)(uVar51 + 0x40 + lVar42 * 4) = auVar82._0_4_;
        uVar5 = vextractps_avx(auVar82,1);
        *(undefined4 *)(uVar51 + 0x80 + lVar42 * 4) = uVar5;
        auVar119._0_4_ = auVar67._0_4_ + auVar66._0_4_ * 4.7683716e-07;
        auVar119._4_4_ = auVar67._4_4_ + auVar66._4_4_ * 4.7683716e-07;
        auVar119._8_4_ = auVar67._8_4_ + auVar66._8_4_ * 4.7683716e-07;
        auVar119._12_4_ = auVar67._12_4_ + auVar66._12_4_ * 4.7683716e-07;
        uVar5 = vextractps_avx(auVar82,2);
        *(undefined4 *)(uVar51 + 0xc0 + lVar42 * 4) = uVar5;
        *(float *)(uVar51 + 0x60 + lVar42 * 4) = auVar125._0_4_;
        uVar5 = vextractps_avx(auVar125,1);
        *(undefined4 *)(uVar51 + 0xa0 + lVar42 * 4) = uVar5;
        auVar66 = vsubps_avx(auVar68,auVar82);
        uVar5 = vextractps_avx(auVar125,2);
        *(undefined4 *)(uVar51 + 0xe0 + lVar42 * 4) = uVar5;
        *(int *)(uVar51 + 0x100 + lVar42 * 4) = auVar66._0_4_;
        uVar5 = vextractps_avx(auVar66,1);
        *(undefined4 *)(uVar51 + 0x140 + lVar42 * 4) = uVar5;
        auVar68 = vsubps_avx(auVar119,auVar125);
        uVar5 = vextractps_avx(auVar66,2);
        *(undefined4 *)(uVar51 + 0x180 + lVar42 * 4) = uVar5;
        *(int *)(uVar51 + 0x120 + lVar42 * 4) = auVar68._0_4_;
        uVar5 = vextractps_avx(auVar68,1);
        *(undefined4 *)(uVar51 + 0x160 + lVar42 * 4) = uVar5;
        uVar5 = vextractps_avx(auVar68,2);
        *(undefined4 *)(uVar51 + 0x1a0 + lVar42 * 4) = uVar5;
        *(float *)(uVar51 + 0x1c0 + lVar42 * 4) = fVar85;
        auVar66 = vcmpss_avx(ZEXT416((uint)fVar74),SUB6416(ZEXT464(0x3f800000),0),0);
        auVar66 = vblendvps_avx(ZEXT416((uint)fVar74),auVar109,auVar66);
        *(int *)(uVar51 + 0x1e0 + lVar42 * 4) = auVar66._0_4_;
        lVar42 = lVar42 + 1;
        pfVar47 = pfVar47 + 0x18;
      } while (local_848 != lVar42);
    }
    uVar51 = (ulong)(uint)local_1e08._0_4_;
    fVar74 = (float)local_1e38._0_4_;
    fVar85 = (float)local_1e38._4_4_;
    fVar106 = fStack_1e30;
    fVar115 = fStack_1e2c;
    pBVar136 = this;
  }
  uVar27 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
  uVar26 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
  if ((char)uVar51 == '\0') {
    (local_1de8->ref).ptr = uVar60 | (ulong)pcVar50;
    *(undefined8 *)&(local_1de8->lbounds).bounds0.lower.field_0 = local_1dc8._0_8_;
    *(undefined8 *)((long)&(local_1de8->lbounds).bounds0.lower.field_0 + 8) = local_1dc8._8_8_;
    *(undefined8 *)&(local_1de8->lbounds).bounds0.upper.field_0 = local_1df8._0_8_;
    *(undefined8 *)((long)&(local_1de8->lbounds).bounds0.upper.field_0 + 8) = local_1df8._8_8_;
    (local_1de8->lbounds).bounds1.lower.field_0.m128[0] = fVar74;
    (local_1de8->lbounds).bounds1.lower.field_0.m128[1] = fVar85;
    (local_1de8->lbounds).bounds1.lower.field_0.m128[2] = fVar106;
    (local_1de8->lbounds).bounds1.lower.field_0.m128[3] = fVar115;
    uVar53 = local_1e58._0_8_;
    uVar73 = local_1e58._8_8_;
  }
  else {
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos.field_0.v[0] = (longlong)&current.super_BuildRecord.prims;
    v1.field_0.i[2] = 0x7f800000;
    v1.field_0.v[0] = 0x7f8000007f800000;
    v1.field_0.i[3] = 0x7f800000;
    local_1b18._0_8_ = 0xff800000ff800000;
    local_1b18._8_8_ = 0xff800000ff800000;
    uStack_1b08 = 0x7f8000007f800000;
    uStack_1b00 = 0x7f8000007f800000;
    local_1af8 = 0xff800000ff800000;
    uStack_1af0 = 0xff800000ff800000;
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end -
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin < 0xc00) {
      v0.field_0.v[1] = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      v0.field_0.v[0] = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&v2,(anon_class_16_2_aeee9775 *)&vSplitPos,(range<unsigned_long> *)&v0)
      ;
    }
    else {
      v0.field_0.v[1]._4_2_ = 0x401;
      aStack_1bf8._0_8_ = 0;
      aStack_1bf8._8_8_ = 0;
      aStack_1bd8._0_8_ = 8;
      tbb::detail::r1::initialize((task_group_context *)&v0);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           uVar26;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           uVar27;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&v2,(d1 *)&right,(blocked_range<unsigned_long> *)&v1,
                 (LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,(anon_class_1_0_00000001 *)&v0,
                 (task_group_context *)pBVar136);
      cVar30 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&v0);
      if (cVar30 != '\0') {
        prVar40 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar40,"task cancelled");
        __cxa_throw(prVar40,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&v0);
    }
    (local_1de8->ref).ptr = uVar60 | (ulong)pcVar50;
    *(longlong *)&(local_1de8->lbounds).bounds0.lower.field_0 = v2.field_0.v[0];
    *(longlong *)((long)&(local_1de8->lbounds).bounds0.lower.field_0 + 8) = v2.field_0.v[1];
    *(ulong *)&(local_1de8->lbounds).bounds0.upper.field_0 =
         CONCAT44(aStack_1cd8.m128[1],aStack_1cd8.m128[0]);
    *(ulong *)((long)&(local_1de8->lbounds).bounds0.upper.field_0 + 8) =
         CONCAT44(aStack_1cd8.m128[3],aStack_1cd8.m128[2]);
    *(ulong *)&(local_1de8->lbounds).bounds1.lower.field_0 =
         CONCAT44(local_1cc8.m128[1],local_1cc8.m128[0]);
    *(ulong *)((long)&(local_1de8->lbounds).bounds1.lower.field_0 + 8) =
         CONCAT44(local_1cc8.m128[3],local_1cc8.m128[2]);
    uVar53 = CONCAT44(aStack_1cb8.m128[1],aStack_1cb8.m128[0]);
    uVar73 = CONCAT44(aStack_1cb8.m128[3],aStack_1cb8.m128[2]);
  }
  *(undefined8 *)&(local_1de8->lbounds).bounds1.upper.field_0 = uVar53;
  *(undefined8 *)((long)&(local_1de8->lbounds).bounds1.upper.field_0 + 8) = uVar73;
  local_1de8->dt = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
  if (local_848 == 0) {
    return local_1de8;
  }
  uVar51 = 0;
  do {
    pBVar10 = local_8c8[uVar51];
    pBVar41 = pBVar10 + 1;
    *pBVar41 = (BBox1f)((long)*pBVar41 + -1);
    if (*pBVar41 == (BBox1f)0x0) {
      BVar43 = *pBVar10;
      if (BVar43 != (BBox1f)0x0) {
        lVar42 = *(long *)((long)BVar43 + 0x18);
        pvVar35 = *(void **)((long)BVar43 + 0x20);
        if (pvVar35 != (void *)0x0) {
          if ((ulong)(lVar42 * 0x50) < 0x1c00000) {
            alignedFree(pvVar35);
          }
          else {
            os_free(pvVar35,lVar42 * 0x50,*(bool *)((long)BVar43 + 8));
          }
        }
        if (lVar42 != 0) {
          (**(code **)**(undefined8 **)BVar43)(*(undefined8 **)BVar43,lVar42 * -0x50,1);
        }
        *(undefined8 *)((long)BVar43 + 0x10) = 0;
        *(undefined8 *)((long)BVar43 + 0x18) = 0;
        *(undefined8 *)((long)BVar43 + 0x20) = 0;
      }
      operator_delete((void *)BVar43);
    }
    uVar51 = uVar51 + 1;
  } while (uVar51 < local_848);
  return local_1de8;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }